

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

uchar * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  uchar uVar2;
  short sVar3;
  stbi__gif_lzw sVar4;
  stbi__uint32 sVar5;
  undefined8 uVar6;
  stbi__gif_lzw sVar7;
  stbi_uc sVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  stbi__uint32 sVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  void *pvVar23;
  _func_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int *p_Var24;
  uchar *puVar25;
  stbi_uc *psVar26;
  stbi__context *data_00;
  float *data_01;
  stbi_uc *psVar27;
  byte *pbVar28;
  stbi__context *psVar29;
  bool bVar30;
  byte bVar31;
  undefined1 uVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  int *piVar39;
  stbi__uint32 z;
  uint uVar40;
  uint uVar41;
  ulong unaff_RBP;
  int *piVar42;
  ulong uVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  uchar *puVar47;
  uint uVar48;
  uint uVar49;
  short *psVar50;
  size_t sVar51;
  stbi_uc (*pal) [4];
  short sVar52;
  bool bVar53;
  bool bVar54;
  stbi_uc *coutput [4];
  short data [64];
  stbi__jpeg j;
  stbi__int16 *local_4a10;
  stbi__context *local_4a08;
  uint local_4a00;
  uint local_49f0;
  int local_49bc;
  int local_49b8;
  int local_49b4;
  int local_49a0;
  uint local_4994;
  stbi_uc *local_4968 [4];
  short local_4948 [4];
  undefined8 local_4940 [2];
  int local_4930 [42];
  undefined1 local_4888 [16];
  undefined8 local_4878;
  undefined8 local_4870;
  uint local_4868;
  stbi_uc local_4864 [2048];
  undefined2 uStack_4064;
  undefined1 auStack_4062 [4642];
  stbi__huffman local_2e40 [4];
  byte local_1400 [256];
  stbi__int16 local_1300 [2048];
  stbi__gif_lzw local_300;
  stbi__gif_lzw local_2fc;
  stbi__gif_lzw local_2f8;
  stbi__gif_lzw local_2f4;
  int local_2e8;
  uint auStack_2e4 [5];
  stbi__gif_lzw local_2d0;
  int local_2cc [5];
  long local_2b8 [9];
  stbi__gif_lzw local_270;
  stbi__gif_lzw local_210;
  undefined8 local_168;
  byte local_160;
  stbi__gif_lzw local_15c;
  stbi__gif_lzw local_158;
  stbi__gif_lzw local_154;
  stbi__gif_lzw local_150;
  stbi__gif_lzw local_14c;
  stbi__gif_lzw local_148;
  stbi__gif_lzw local_144;
  stbi__gif_lzw local_140;
  stbi__gif_lzw local_13c [4];
  stbi__gif_lzw local_12c;
  stbi__gif_lzw local_128;
  _func_void_stbi_uc_ptr_int_short_ptr *local_120;
  _func_void_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int *local_118;
  _func_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int *local_110;
  stbi_uc (*local_60) [4];
  uint local_58;
  int local_54;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_120 = stbi__idct_block;
  local_118 = stbi__YCbCr_to_RGB_row;
  local_110 = stbi__resample_row_hv_2;
  local_160 = 0xff;
  local_4888._0_8_ = s;
  sVar8 = stbi__get_marker((stbi__jpeg *)local_4888);
  if (sVar8 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  if (sVar8 == 0xd8) {
    local_120 = stbi__idct_block;
    local_118 = stbi__YCbCr_to_RGB_row;
    local_110 = stbi__resample_row_hv_2;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      lVar20 = 0x45d8;
      do {
        *(undefined8 *)(local_4888 + lVar20) = 0;
        *(undefined8 *)(local_4888 + lVar20 + 8) = 0;
        lVar20 = lVar20 + 0x60;
      } while (lVar20 != 0x4758);
      local_12c.prefix = 0;
      local_12c.first = '\0';
      local_12c.suffix = '\0';
      local_4888._0_8_ = s;
      iVar11 = stbi__decode_jpeg_header((stbi__jpeg *)local_4888,0);
      do {
        if (iVar11 == 0) {
LAB_0010e1bf:
          stbi__cleanup_jpeg((stbi__jpeg *)local_4888);
          return (uchar *)0x0;
        }
LAB_0010c24f:
        bVar9 = stbi__get_marker((stbi__jpeg *)local_4888);
        if (bVar9 == 0xda) {
          iVar11 = stbi__get16be((stbi__context *)local_4888._0_8_);
          uVar6 = local_4888._0_8_;
          pbVar28 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
          if (pbVar28 < *(stbi_uc **)(local_4888._0_8_ + 0xc0)) {
LAB_0010c2e8:
            *(byte **)(uVar6 + 0xb8) = pbVar28 + 1;
            bVar9 = *pbVar28;
          }
          else {
            if (*(int *)(local_4888._0_8_ + 0x30) != 0) {
              psVar26 = (stbi_uc *)(local_4888._0_8_ + 0x38);
              iVar12 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read)
                                 (*(void **)(local_4888._0_8_ + 0x28),(char *)psVar26,
                                  *(int *)(local_4888._0_8_ + 0x34));
              if (iVar12 == 0) {
                *(int *)(uVar6 + 0x30) = 0;
                *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                *(stbi_uc **)(uVar6 + 0xc0) = (stbi_uc *)(uVar6 + 0x38) + 1;
                *(stbi_uc *)(uVar6 + 0x38) = '\0';
              }
              else {
                *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                *(stbi_uc **)(uVar6 + 0xc0) = psVar26 + iVar12;
              }
              pbVar28 = *(stbi_uc **)(uVar6 + 0xb8);
              goto LAB_0010c2e8;
            }
            bVar9 = 0;
          }
          local_140._1_3_ = 0;
          local_140.prefix._0_1_ = bVar9;
          if (((byte)(bVar9 - 5) < 0xfc) || (*(int *)(local_4888._0_8_ + 8) < (int)(uint)bVar9)) {
            stbi__g_failure_reason = "bad SOS component count";
          }
          else {
            if (iVar11 == (uint)bVar9 * 2 + 6) {
              if (bVar9 != 0) {
                lVar20 = 0;
                do {
                  uVar6 = local_4888._0_8_;
                  pbVar28 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
                  if (pbVar28 < *(stbi_uc **)(local_4888._0_8_ + 0xc0)) {
LAB_0010c3ab:
                    *(byte **)(uVar6 + 0xb8) = pbVar28 + 1;
                    unaff_RBP = (ulong)*pbVar28;
                  }
                  else {
                    if (*(int *)(local_4888._0_8_ + 0x30) != 0) {
                      psVar26 = (stbi_uc *)(local_4888._0_8_ + 0x38);
                      iVar11 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read)
                                         (*(void **)(local_4888._0_8_ + 0x28),(char *)psVar26,
                                          *(int *)(local_4888._0_8_ + 0x34));
                      if (iVar11 == 0) {
                        *(int *)(uVar6 + 0x30) = 0;
                        *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                        *(stbi_uc **)(uVar6 + 0xc0) = (stbi_uc *)(uVar6 + 0x38) + 1;
                        *(stbi_uc *)(uVar6 + 0x38) = '\0';
                      }
                      else {
                        *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                        *(stbi_uc **)(uVar6 + 0xc0) = psVar26 + iVar11;
                      }
                      pbVar28 = *(stbi_uc **)(uVar6 + 0xb8);
                      goto LAB_0010c3ab;
                    }
                    unaff_RBP = 0;
                  }
                  uVar6 = local_4888._0_8_;
                  pbVar28 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
                  if (pbVar28 < *(stbi_uc **)(local_4888._0_8_ + 0xc0)) {
LAB_0010c42e:
                    *(byte **)(uVar6 + 0xb8) = pbVar28 + 1;
                    bVar9 = *pbVar28;
                  }
                  else {
                    if (*(int *)(local_4888._0_8_ + 0x30) != 0) {
                      psVar26 = (stbi_uc *)(local_4888._0_8_ + 0x38);
                      iVar11 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read)
                                         (*(void **)(local_4888._0_8_ + 0x28),(char *)psVar26,
                                          *(int *)(local_4888._0_8_ + 0x34));
                      if (iVar11 == 0) {
                        *(int *)(uVar6 + 0x30) = 0;
                        *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                        *(stbi_uc **)(uVar6 + 0xc0) = (stbi_uc *)(uVar6 + 0x38) + 1;
                        *(stbi_uc *)(uVar6 + 0x38) = '\0';
                      }
                      else {
                        *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                        *(stbi_uc **)(uVar6 + 0xc0) = psVar26 + iVar11;
                      }
                      pbVar28 = *(stbi_uc **)(uVar6 + 0xb8);
                      goto LAB_0010c42e;
                    }
                    bVar9 = 0;
                  }
                  sVar4 = *(stbi__gif_lzw *)(local_4888._0_8_ + 8);
                  if ((int)sVar4 < 1) {
                    uVar21 = 0;
                  }
                  else {
                    uVar21 = 0;
                    piVar42 = &local_2e8;
                    do {
                      if (*piVar42 == (int)unaff_RBP) goto LAB_0010c465;
                      uVar21 = uVar21 + 1;
                      piVar42 = piVar42 + 0x18;
                    } while ((uint)sVar4 != uVar21);
                    uVar21 = (ulong)(uint)sVar4;
                  }
LAB_0010c465:
                  if (SUB84(uVar21,0) == sVar4) goto LAB_0010e1bf;
                  auStack_2e4[(uVar21 & 0xffffffff) * 0x18 + 3] = (uint)(bVar9 >> 4);
                  if (0x3f < bVar9) {
                    stbi__g_failure_reason = "bad DC huff";
                    goto LAB_0010e1bf;
                  }
                  auStack_2e4[(uVar21 & 0xffffffff) * 0x18 + 4] = bVar9 & 0xf;
                  if (3 < (bVar9 & 0xf)) {
                    stbi__g_failure_reason = "bad AC huff";
                    goto LAB_0010e1bf;
                  }
                  local_13c[lVar20] = SUB84(uVar21,0);
                  lVar20 = lVar20 + 1;
                } while (lVar20 < (int)local_140);
              }
              uVar6 = local_4888._0_8_;
              pbVar28 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
              if (pbVar28 < *(stbi_uc **)(local_4888._0_8_ + 0xc0)) {
LAB_0010c530:
                *(byte **)(uVar6 + 0xb8) = pbVar28 + 1;
                local_154._1_3_ = 0;
                local_154.prefix._0_1_ = *pbVar28;
              }
              else {
                if (*(int *)(local_4888._0_8_ + 0x30) != 0) {
                  psVar26 = (stbi_uc *)(local_4888._0_8_ + 0x38);
                  iVar11 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read)
                                     (*(void **)(local_4888._0_8_ + 0x28),(char *)psVar26,
                                      *(int *)(local_4888._0_8_ + 0x34));
                  if (iVar11 == 0) {
                    *(int *)(uVar6 + 0x30) = 0;
                    *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                    *(stbi_uc **)(uVar6 + 0xc0) = (stbi_uc *)(uVar6 + 0x38) + 1;
                    *(stbi_uc *)(uVar6 + 0x38) = '\0';
                  }
                  else {
                    *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                    *(stbi_uc **)(uVar6 + 0xc0) = psVar26 + iVar11;
                  }
                  pbVar28 = *(stbi_uc **)(uVar6 + 0xb8);
                  goto LAB_0010c530;
                }
                local_154.prefix = 0;
                local_154.first = '\0';
                local_154.suffix = '\0';
              }
              uVar6 = local_4888._0_8_;
              pbVar28 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
              if (pbVar28 < *(stbi_uc **)(local_4888._0_8_ + 0xc0)) {
LAB_0010c5ba:
                *(byte **)(uVar6 + 0xb8) = pbVar28 + 1;
                local_150._1_3_ = 0;
                local_150.prefix._0_1_ = *pbVar28;
              }
              else {
                if (*(int *)(local_4888._0_8_ + 0x30) != 0) {
                  psVar26 = (stbi_uc *)(local_4888._0_8_ + 0x38);
                  iVar11 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read)
                                     (*(void **)(local_4888._0_8_ + 0x28),(char *)psVar26,
                                      *(int *)(local_4888._0_8_ + 0x34));
                  if (iVar11 == 0) {
                    *(int *)(uVar6 + 0x30) = 0;
                    *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                    *(stbi_uc **)(uVar6 + 0xc0) = (stbi_uc *)(uVar6 + 0x38) + 1;
                    *(stbi_uc *)(uVar6 + 0x38) = '\0';
                  }
                  else {
                    *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                    *(stbi_uc **)(uVar6 + 0xc0) = psVar26 + iVar11;
                  }
                  pbVar28 = *(stbi_uc **)(uVar6 + 0xb8);
                  goto LAB_0010c5ba;
                }
                local_150.prefix = 0;
                local_150.first = '\0';
                local_150.suffix = '\0';
              }
              uVar6 = local_4888._0_8_;
              pbVar28 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
              if (pbVar28 < *(stbi_uc **)(local_4888._0_8_ + 0xc0)) {
LAB_0010c644:
                *(byte **)(uVar6 + 0xb8) = pbVar28 + 1;
                bVar9 = *pbVar28;
              }
              else {
                if (*(int *)(local_4888._0_8_ + 0x30) != 0) {
                  psVar26 = (stbi_uc *)(local_4888._0_8_ + 0x38);
                  iVar11 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read)
                                     (*(void **)(local_4888._0_8_ + 0x28),(char *)psVar26,
                                      *(int *)(local_4888._0_8_ + 0x34));
                  if (iVar11 == 0) {
                    *(int *)(uVar6 + 0x30) = 0;
                    *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                    *(stbi_uc **)(uVar6 + 0xc0) = (stbi_uc *)(uVar6 + 0x38) + 1;
                    *(stbi_uc *)(uVar6 + 0x38) = '\0';
                  }
                  else {
                    *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                    *(stbi_uc **)(uVar6 + 0xc0) = psVar26 + iVar11;
                  }
                  pbVar28 = *(stbi_uc **)(uVar6 + 0xb8);
                  goto LAB_0010c644;
                }
                bVar9 = 0;
              }
              sVar4 = local_13c[0];
              local_14c._1_3_ = 0;
              local_14c.prefix._0_1_ = bVar9 >> 4;
              local_148 = (stbi__gif_lzw)(bVar9 & 0xf);
              if (local_158 == (stbi__gif_lzw)0x0) {
                if ((local_154 != (stbi__gif_lzw)0x0) || ((0xf < bVar9 || ((bVar9 & 0xf) != 0)))) {
LAB_0010dcaf:
                  stbi__g_failure_reason = "bad SOS";
                  goto LAB_0010e1bf;
                }
                local_150.prefix = 0x3f;
                local_150.first = '\0';
                local_150.suffix = '\0';
              }
              else if ((((0x3f < (int)local_154) || (0x3f < (int)local_150)) ||
                       ((int)local_150 < (int)local_154)) ||
                      ((0xdf < bVar9 || (0xd < (bVar9 & 0xf))))) goto LAB_0010dcaf;
              local_128 = local_12c;
              if (local_12c == (stbi__gif_lzw)0x0) {
                local_128.prefix = -1;
                local_128.first = 0xff;
                local_128.suffix = '\x7f';
              }
              local_168._0_2_ = 0;
              local_168._2_1_ = '\0';
              local_168._3_1_ = '\0';
              local_168._4_2_ = 0;
              local_168._6_1_ = '\0';
              local_168._7_1_ = '\0';
              local_15c.prefix = 0;
              local_15c.first = '\0';
              local_15c.suffix = '\0';
              local_210.prefix = 0;
              local_210.first = '\0';
              local_210.suffix = '\0';
              local_270.prefix = 0;
              local_270.first = '\0';
              local_270.suffix = '\0';
              local_2d0.prefix = 0;
              local_2d0.first = '\0';
              local_2d0.suffix = '\0';
              local_160 = 0xff;
              local_144.prefix = 0;
              local_144.first = '\0';
              local_144.suffix = '\0';
              if (local_158 == (stbi__gif_lzw)0x0) {
                if (local_140 == (stbi__gif_lzw)0x1) {
                  lVar20 = (long)(int)local_13c[0];
                  iVar12 = local_2cc[lVar20 * 0x18 + 1] + 7 >> 3;
                  iVar11 = 1;
                  if (0 < iVar12) {
                    uVar41 = local_2cc[lVar20 * 0x18] + 7 >> 3;
                    iVar33 = 0;
                    iVar13 = 0;
                    do {
                      if (0 < (int)uVar41) {
                        lVar38 = 0;
                        do {
                          iVar11 = stbi__jpeg_decode_block
                                             ((stbi__jpeg *)local_4888,local_4948,
                                              (stbi__huffman *)
                                              (local_4888 +
                                              (long)(int)auStack_2e4[lVar20 * 0x18 + 3] * 0x690 + 8)
                                              ,local_2e40 + (int)auStack_2e4[lVar20 * 0x18 + 4],
                                              local_1300 +
                                              (long)(int)auStack_2e4[lVar20 * 0x18 + 4] * 0x200,
                                              (int)sVar4,
                                              local_1400 +
                                              (long)(int)auStack_2e4[lVar20 * 0x18 + 2] * 0x40);
                          if (iVar11 == 0) {
                            unaff_RBP = 0;
                            local_4a10 = (stbi__int16 *)0x0;
                          }
                          else {
                            (*local_120)((stbi_uc *)
                                         ((long)(iVar33 * local_2cc[lVar20 * 0x18 + 2]) +
                                          local_2b8[lVar20 * 0xc] + lVar38),
                                         local_2cc[lVar20 * 0x18 + 2],local_4948);
                            sVar7 = local_128;
                            local_128 = (stbi__gif_lzw)((int)local_128 + -1);
                            unaff_RBP = CONCAT71((int7)((ulong)local_4948 >> 8),1);
                            if ((int)sVar7 < 2) {
                              if ((int)local_168._4_4_ < 0x18) {
                                stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                              }
                              if ((local_160 & 0xf8) == 0xd0) {
                                local_168._0_2_ = 0;
                                local_168._2_1_ = '\0';
                                local_168._3_1_ = '\0';
                                local_168._4_2_ = 0;
                                local_168._6_1_ = '\0';
                                local_168._7_1_ = '\0';
                                local_15c.prefix = 0;
                                local_15c.first = '\0';
                                local_15c.suffix = '\0';
                                local_210.prefix = 0;
                                local_210.first = '\0';
                                local_210.suffix = '\0';
                                local_270.prefix = 0;
                                local_270.first = '\0';
                                local_270.suffix = '\0';
                                local_2d0.prefix = 0;
                                local_2d0.first = '\0';
                                local_2d0.suffix = '\0';
                                local_160 = 0xff;
                                local_128 = local_12c;
                                if (local_12c == (stbi__gif_lzw)0x0) {
                                  local_128.prefix = -1;
                                  local_128.first = 0xff;
                                  local_128.suffix = '\x7f';
                                }
                                local_144.prefix = 0;
                                local_144.first = '\0';
                                local_144.suffix = '\0';
                              }
                              else {
                                local_4a10 = (stbi__int16 *)0x1;
                                unaff_RBP = 0;
                              }
                            }
                          }
                          if ((char)unaff_RBP == '\0') {
                            iVar11 = (int)local_4a10;
                            goto LAB_0010d63c;
                          }
                          lVar38 = lVar38 + 8;
                        } while ((ulong)uVar41 * 8 - lVar38 != 0);
                      }
                      iVar11 = 1;
                      iVar13 = iVar13 + 1;
                      iVar33 = iVar33 + 8;
                    } while (iVar13 != iVar12);
                  }
                }
                else {
                  iVar11 = 1;
                  if (0 < (int)local_2f4) {
                    iVar12 = 0;
                    do {
                      if (0 < (int)local_2f8) {
                        iVar13 = 0;
                        do {
                          if (0 < (int)local_140) {
                            lVar20 = 0;
                            do {
                              sVar4 = local_13c[lVar20];
                              local_4a10 = (stbi__int16 *)(long)(int)sVar4;
                              if (0 < (int)auStack_2e4[(long)local_4a10 * 0x18 + 1]) {
                                iVar11 = 0;
                                bVar54 = true;
                                do {
                                  unaff_RBP = (ulong)auStack_2e4[(long)local_4a10 * 0x18];
                                  if (0 < (int)auStack_2e4[(long)local_4a10 * 0x18]) {
                                    iVar33 = 0;
                                    do {
                                      uVar41 = auStack_2e4[(long)local_4a10 * 0x18 + 1];
                                      iVar14 = stbi__jpeg_decode_block
                                                         ((stbi__jpeg *)local_4888,local_4948,
                                                          (stbi__huffman *)
                                                          (local_4888 +
                                                          (long)(int)auStack_2e4
                                                                     [(long)local_4a10 * 0x18 + 3] *
                                                          0x690 + 8),
                                                          local_2e40 +
                                                          (int)auStack_2e4
                                                               [(long)local_4a10 * 0x18 + 4],
                                                          local_1300 +
                                                          (long)(int)auStack_2e4
                                                                     [(long)local_4a10 * 0x18 + 4] *
                                                          0x200,(int)sVar4,
                                                          local_1400 +
                                                          (long)(int)auStack_2e4
                                                                     [(long)local_4a10 * 0x18 + 2] *
                                                          0x40);
                                      if (iVar14 == 0) {
                                        if (bVar54) goto LAB_0010d623;
                                        goto LAB_0010d534;
                                      }
                                      (*local_120)((stbi_uc *)
                                                   ((long)(((int)unaff_RBP * iVar13 + iVar33) * 8) +
                                                   (long)(int)((uVar41 * iVar12 + iVar11) *
                                                               local_2cc[(long)local_4a10 * 0x18 + 2
                                                                        ] * 8) +
                                                   local_2b8[(long)local_4a10 * 0xc]),
                                                   local_2cc[(long)local_4a10 * 0x18 + 2],local_4948
                                                  );
                                      iVar33 = iVar33 + 1;
                                      unaff_RBP = (ulong)auStack_2e4[(long)local_4a10 * 0x18];
                                    } while (iVar33 < (int)auStack_2e4[(long)local_4a10 * 0x18]);
                                  }
                                  iVar11 = iVar11 + 1;
                                  bVar54 = iVar11 < (int)auStack_2e4[(long)local_4a10 * 0x18 + 1];
                                } while (iVar11 < (int)auStack_2e4[(long)local_4a10 * 0x18 + 1]);
                              }
LAB_0010d534:
                              lVar20 = lVar20 + 1;
                            } while (lVar20 < (int)local_140);
                          }
                          sVar4 = local_128;
                          local_128 = (stbi__gif_lzw)((int)local_128 + -1);
                          if ((int)sVar4 < 2) {
                            if ((int)local_168._4_4_ < 0x18) {
                              stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                            }
                            iVar11 = 1;
                            if ((local_160 & 0xf8) != 0xd0) goto LAB_0010d63c;
                            local_168._0_2_ = 0;
                            local_168._2_1_ = '\0';
                            local_168._3_1_ = '\0';
                            local_168._4_2_ = 0;
                            local_168._6_1_ = '\0';
                            local_168._7_1_ = '\0';
                            local_15c.prefix = 0;
                            local_15c.first = '\0';
                            local_15c.suffix = '\0';
                            local_210.prefix = 0;
                            local_210.first = '\0';
                            local_210.suffix = '\0';
                            local_270.prefix = 0;
                            local_270.first = '\0';
                            local_270.suffix = '\0';
                            local_2d0.prefix = 0;
                            local_2d0.first = '\0';
                            local_2d0.suffix = '\0';
                            local_160 = 0xff;
                            local_128 = local_12c;
                            if (local_12c == (stbi__gif_lzw)0x0) {
                              local_128.prefix = -1;
                              local_128.first = 0xff;
                              local_128.suffix = '\x7f';
                            }
                            local_144.prefix = 0;
                            local_144.first = '\0';
                            local_144.suffix = '\0';
                          }
                          iVar13 = iVar13 + 1;
                        } while (iVar13 < (int)local_2f8);
                      }
                      iVar12 = iVar12 + 1;
                      iVar11 = 1;
                    } while (iVar12 < (int)local_2f4);
                  }
                }
              }
              else if (local_140 == (stbi__gif_lzw)0x1) {
                lVar20 = (long)(int)local_13c[0];
                iVar12 = local_2cc[lVar20 * 0x18 + 1] + 7 >> 3;
                iVar11 = 1;
                if (0 < iVar12) {
                  iVar13 = local_2cc[lVar20 * 0x18] + 7 >> 3;
                  iVar11 = 0;
                  do {
                    if (0 < iVar13) {
                      iVar33 = 0;
                      do {
                        psVar50 = (short *)((long)(((int)local_2b8[lVar20 * 0xc + 5] * iVar11 +
                                                   iVar33) * 0x40) * 2 + local_2b8[lVar20 * 0xc + 4]
                                           );
                        uVar21 = (ulong)(int)local_154;
                        if (uVar21 == 0) {
                          iVar14 = stbi__jpeg_decode_block_prog_dc
                                             ((stbi__jpeg *)local_4888,psVar50,
                                              (stbi__huffman *)
                                              (local_4888 +
                                              (long)(int)auStack_2e4[lVar20 * 0x18 + 3] * 0x690 + 8)
                                              ,(int)sVar4);
                          if (iVar14 != 0) goto LAB_0010cc15;
                          bVar54 = false;
                          unaff_RBP = 0;
                        }
                        else {
                          lVar38 = (long)(int)auStack_2e4[lVar20 * 0x18 + 4];
                          uVar41 = (uint)unaff_RBP;
                          bVar9 = (byte)local_148.prefix;
                          if (local_14c == (stbi__gif_lzw)0x0) {
                            if (local_144 == (stbi__gif_lzw)0x0) {
                              local_4a10 = local_1300 + lVar38 * 0x200;
                              do {
                                if ((int)local_168._4_4_ < 0x10) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                }
                                uVar37 = (uint)local_4a10[(uint)local_168._0_4_ >> 0x17];
                                iVar14 = (int)uVar21;
                                if (local_4a10[(uint)local_168._0_4_ >> 0x17] == 0) {
                                  if ((int)local_168._4_4_ < 0x10) {
                                    stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                  }
                                  uVar22 = (ulong)local_2e40[lVar38].fast
                                                  [(uint)local_168._0_4_ >> 0x17];
                                  if (uVar22 == 0xff) {
                                    lVar45 = 0;
                                    do {
                                      lVar46 = lVar45;
                                      lVar45 = lVar46 + 1;
                                    } while (local_2e40[lVar38].maxcode[lVar46 + 10] <=
                                             (uint)local_168._0_4_ >> 0x10);
                                    if (lVar45 == 8) {
                                      local_168._4_4_ =
                                           (stbi__gif_lzw)((int)local_168._4_4_ + -0x10);
                                      uVar37 = 0xffffffff;
                                    }
                                    else {
                                      uVar37 = 0xffffffff;
                                      if ((int)(lVar46 + 10) <= (int)local_168._4_4_) {
                                        uVar37 = (uint)local_168._0_4_ >>
                                                 (0x17U - (char)lVar45 & 0x1f);
                                        local_168._4_4_ =
                                             (stbi__gif_lzw)
                                             (((int)local_168._4_4_ - (int)lVar45) + -9);
                                        local_168._0_4_ =
                                             (stbi__gif_lzw)
                                             ((int)local_168._0_4_ << ((byte)(lVar46 + 10) & 0x1f));
                                        uVar22 = (ulong)(int)((uVar37 & stbi__bmask[lVar46 + 10]) +
                                                             local_2e40[lVar38].delta[lVar46 + 10]);
                                        goto LAB_0010ce57;
                                      }
                                    }
                                  }
                                  else {
                                    bVar31 = local_2e40[lVar38].size[uVar22];
                                    uVar37 = 0xffffffff;
                                    if ((int)(uint)bVar31 <= (int)local_168._4_4_) {
                                      local_168._4_4_ =
                                           (stbi__gif_lzw)((int)local_168._4_4_ - (uint)bVar31);
                                      local_168._0_4_ =
                                           (stbi__gif_lzw)((int)local_168._0_4_ << (bVar31 & 0x1f));
LAB_0010ce57:
                                      uVar37 = (uint)local_2e40[lVar38].values[uVar22];
                                    }
                                  }
                                  if ((int)uVar37 < 0) {
                                    stbi__g_failure_reason = "bad huffman code";
                                    iVar16 = 1;
                                    bVar54 = false;
                                  }
                                  else {
                                    uVar40 = uVar37 >> 4;
                                    uVar15 = uVar37 & 0xf;
                                    if (uVar15 == 0) {
                                      if (0xef < uVar37) {
                                        uVar15 = iVar14 + 0x10;
                                        goto LAB_0010cd74;
                                      }
                                      local_144 = (stbi__gif_lzw)(1 << ((byte)uVar40 & 0x1f));
                                      if (0xf < uVar37) {
                                        if ((int)local_168._4_4_ < (int)uVar40) {
                                          stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                        }
                                        bVar31 = (byte)uVar40 & 0x1f;
                                        uVar37 = (int)local_168._0_4_ << bVar31 |
                                                 (uint)local_168._0_4_ >> 0x20 - bVar31;
                                        local_168._4_4_ =
                                             (stbi__gif_lzw)((int)local_168._4_4_ - uVar40);
                                        local_168._0_4_ =
                                             (stbi__gif_lzw)(~stbi__bmask[uVar40] & uVar37);
                                        local_144 = (stbi__gif_lzw)
                                                    ((int)local_144 + (uVar37 & stbi__bmask[uVar40])
                                                    );
                                      }
                                      local_144 = (stbi__gif_lzw)((int)local_144 - 1);
                                      iVar16 = 2;
                                      bVar54 = false;
                                    }
                                    else {
                                      bVar31 = ""[(long)iVar14 + (ulong)uVar40];
                                      if ((int)local_168._4_4_ < (int)uVar15) {
                                        stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                      }
                                      sVar7 = local_168._0_4_;
                                      uVar36 = (int)local_168._0_4_ << (sbyte)uVar15 |
                                               (uint)local_168._0_4_ >> 0x20 - (sbyte)uVar15;
                                      uVar37 = *(uint *)((long)stbi__bmask + (ulong)(uVar15 * 4));
                                      local_168._4_4_ =
                                           (stbi__gif_lzw)((int)local_168._4_4_ - uVar15);
                                      local_168._0_4_ = (stbi__gif_lzw)(~uVar37 & uVar36);
                                      iVar16 = 0;
                                      iVar44 = 0;
                                      if (-1 < (int)sVar7) {
                                        iVar44 = *(int *)((long)stbi__jbias + (ulong)(uVar15 * 4));
                                      }
                                      uVar21 = (ulong)((int)((long)iVar14 + (ulong)uVar40) + 1);
                                      psVar50[bVar31] =
                                           (short)((uVar36 & uVar37) + iVar44 << (bVar9 & 0x1f));
                                      bVar54 = true;
                                    }
                                  }
                                }
                                else {
                                  local_168._4_4_ =
                                       (stbi__gif_lzw)((int)local_168._4_4_ - (uVar37 & 0xf));
                                  local_168._0_4_ =
                                       (stbi__gif_lzw)
                                       ((int)local_168._0_4_ << (sbyte)(uVar37 & 0xf));
                                  lVar45 = (long)iVar14 + (ulong)(uVar37 >> 4 & 0xf);
                                  uVar15 = (int)lVar45 + 1;
                                  psVar50[""[lVar45]] = (short)((uVar37 >> 8) << (bVar9 & 0x1f));
LAB_0010cd74:
                                  uVar21 = (ulong)uVar15;
                                  iVar16 = 0;
                                  bVar54 = true;
                                }
                                bVar30 = false;
                                bVar53 = true;
                                if (iVar16 != 0) {
                                  bVar30 = false;
                                  if (iVar16 != 2) {
                                    bVar53 = bVar54;
                                    bVar30 = false;
                                  }
                                  break;
                                }
                              } while ((int)uVar21 <= (int)local_150);
                            }
                            else {
                              local_144 = (stbi__gif_lzw)((int)local_144 - 1);
                              bVar53 = false;
                              bVar30 = true;
                            }
                            if (bVar53) goto LAB_0010cbef;
                          }
                          else {
                            if (local_144 == (stbi__gif_lzw)0x0) {
                              uVar37 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                              local_4a10 = (stbi__int16 *)(ulong)uVar37;
                              do {
                                if ((int)local_168._4_4_ < 0x10) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                }
                                uVar22 = (ulong)local_2e40[lVar38].fast
                                                [(uint)local_168._0_4_ >> 0x17];
                                if (uVar22 == 0xff) {
                                  lVar45 = 0;
                                  do {
                                    lVar46 = lVar45;
                                    lVar45 = lVar46 + 1;
                                  } while (local_2e40[lVar38].maxcode[lVar46 + 10] <=
                                           (uint)local_168._0_4_ >> 0x10);
                                  if (lVar45 == 8) {
                                    local_168._4_4_ = (stbi__gif_lzw)((int)local_168._4_4_ + -0x10);
                                    uVar43 = 0xffffffff;
                                  }
                                  else {
                                    uVar43 = 0xffffffff;
                                    if ((int)(lVar46 + 10) <= (int)local_168._4_4_) {
                                      uVar15 = (uint)local_168._0_4_ >>
                                               (0x17U - (char)lVar45 & 0x1f);
                                      local_168._4_4_ =
                                           (stbi__gif_lzw)
                                           (((int)local_168._4_4_ - (int)lVar45) + -9);
                                      local_168._0_4_ =
                                           (stbi__gif_lzw)
                                           ((int)local_168._0_4_ << ((byte)(lVar46 + 10) & 0x1f));
                                      uVar22 = (ulong)(int)((uVar15 & stbi__bmask[lVar46 + 10]) +
                                                           local_2e40[lVar38].delta[lVar46 + 10]);
                                      goto LAB_0010ca23;
                                    }
                                  }
                                }
                                else {
                                  bVar31 = local_2e40[lVar38].size[uVar22];
                                  uVar43 = 0xffffffff;
                                  if ((int)(uint)bVar31 <= (int)local_168._4_4_) {
                                    local_168._4_4_ =
                                         (stbi__gif_lzw)((int)local_168._4_4_ - (uint)bVar31);
                                    local_168._0_4_ =
                                         (stbi__gif_lzw)((int)local_168._0_4_ << (bVar31 & 0x1f));
LAB_0010ca23:
                                    uVar43 = (ulong)local_2e40[lVar38].values[uVar22];
                                  }
                                }
                                uVar15 = (uint)uVar43;
                                if ((int)uVar15 < 0) {
LAB_0010caca:
                                  stbi__g_failure_reason = "bad huffman code";
                                  bVar54 = false;
                                }
                                else {
                                  uVar22 = uVar43 >> 4;
                                  if ((uVar15 & 0xf) == 1) {
                                    if ((int)local_168._4_4_ < 1) {
                                      stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                    }
                                    sVar7 = local_168._0_4_;
                                    local_168._4_4_ = (stbi__gif_lzw)((int)local_168._4_4_ + -1);
                                    local_168._0_4_ = (stbi__gif_lzw)((int)local_168._0_4_ * 2);
                                    sVar52 = (short)(((int)~(uint)sVar7 >> 0x1f | 1U) <<
                                                    (bVar9 & 0x1f));
                                  }
                                  else {
                                    if ((uVar43 & 0xf) != 0) goto LAB_0010caca;
                                    if (uVar15 < 0xf0) {
                                      local_144 = (stbi__gif_lzw)~(-1 << ((byte)uVar22 & 0x1f));
                                      uVar43 = 0x40;
                                      if (0xf < uVar15) {
                                        if ((int)local_168._4_4_ < (int)uVar22) {
                                          stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                        }
                                        bVar31 = (byte)uVar22 & 0x1f;
                                        uVar15 = (int)local_168._0_4_ << bVar31 |
                                                 (uint)local_168._0_4_ >> 0x20 - bVar31;
                                        local_168._4_4_ =
                                             (stbi__gif_lzw)((int)local_168._4_4_ - (int)uVar22);
                                        local_168._0_4_ =
                                             (stbi__gif_lzw)(~stbi__bmask[uVar22] & uVar15);
                                        local_144 = (stbi__gif_lzw)
                                                    ((int)local_144 + (uVar15 & stbi__bmask[uVar22])
                                                    );
                                      }
                                    }
                                    else {
                                      uVar43 = 0xf;
                                    }
                                    sVar52 = 0;
                                    uVar22 = uVar43;
                                  }
                                  uVar21 = (ulong)(int)uVar21;
                                  do {
                                    if ((long)(int)local_150 < (long)uVar21) break;
                                    bVar31 = ""[uVar21];
                                    if (psVar50[bVar31] == 0) {
                                      if ((int)uVar22 == 0) {
                                        psVar50[bVar31] = sVar52;
                                        bVar54 = false;
                                        uVar22 = 0;
                                      }
                                      else {
                                        uVar22 = (ulong)((int)uVar22 - 1);
                                        bVar54 = true;
                                      }
                                    }
                                    else {
                                      if ((int)local_168._4_4_ < 1) {
                                        stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                      }
                                      sVar7 = local_168._0_4_;
                                      local_168._4_4_ = (stbi__gif_lzw)((int)local_168._4_4_ + -1);
                                      local_168._0_4_ = (stbi__gif_lzw)((int)local_168._0_4_ * 2);
                                      bVar54 = true;
                                      if (((int)sVar7 < 0) &&
                                         (sVar3 = psVar50[bVar31], (uVar37 & (int)sVar3) == 0)) {
                                        uVar15 = uVar37;
                                        if (sVar3 < 1) {
                                          uVar15 = -uVar37;
                                        }
                                        psVar50[bVar31] = sVar3 + (short)uVar15;
                                      }
                                    }
                                    uVar21 = uVar21 + 1;
                                  } while (bVar54);
                                  bVar54 = true;
                                }
                                if (!bVar54) {
                                  bVar30 = false;
                                  goto LAB_0010cbf4;
                                }
                              } while ((int)uVar21 <= (int)local_150);
                            }
                            else {
                              local_144 = (stbi__gif_lzw)((int)local_144 - 1);
                              if ((int)local_154 <= (int)local_150) {
                                uVar37 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                                do {
                                  bVar9 = ""[uVar21];
                                  if (psVar50[bVar9] != 0) {
                                    if ((int)local_168._4_4_ < 1) {
                                      stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                    }
                                    sVar7 = local_168._0_4_;
                                    local_168._4_4_ = (stbi__gif_lzw)((int)local_168._4_4_ + -1);
                                    local_168._0_4_ = (stbi__gif_lzw)((int)local_168._0_4_ * 2);
                                    if (((int)sVar7 < 0) &&
                                       (sVar52 = psVar50[bVar9], (uVar37 & (int)sVar52) == 0)) {
                                      uVar15 = -uVar37;
                                      if (0 < sVar52) {
                                        uVar15 = uVar37;
                                      }
                                      psVar50[bVar9] = (short)uVar15 + sVar52;
                                    }
                                  }
                                  bVar54 = (long)uVar21 < (long)(int)local_150;
                                  uVar21 = uVar21 + 1;
                                } while (bVar54);
                              }
                            }
LAB_0010cbef:
                            bVar30 = true;
                          }
LAB_0010cbf4:
                          if (!bVar30) {
                            uVar41 = 0;
                          }
                          unaff_RBP = (ulong)uVar41;
                          if (!bVar30) {
                            bVar54 = false;
                          }
                          else {
LAB_0010cc15:
                            sVar7 = local_128;
                            local_128 = (stbi__gif_lzw)((int)local_128 + -1);
                            bVar54 = true;
                            if ((int)sVar7 < 2) {
                              if ((int)local_168._4_4_ < 0x18) {
                                stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                              }
                              if ((local_160 & 0xf8) == 0xd0) {
                                local_168._0_2_ = 0;
                                local_168._2_1_ = '\0';
                                local_168._3_1_ = '\0';
                                local_168._4_2_ = 0;
                                local_168._6_1_ = '\0';
                                local_168._7_1_ = '\0';
                                local_15c.prefix = 0;
                                local_15c.first = '\0';
                                local_15c.suffix = '\0';
                                local_210.prefix = 0;
                                local_210.first = '\0';
                                local_210.suffix = '\0';
                                local_270.prefix = 0;
                                local_270.first = '\0';
                                local_270.suffix = '\0';
                                local_2d0.prefix = 0;
                                local_2d0.first = '\0';
                                local_2d0.suffix = '\0';
                                local_160 = 0xff;
                                local_128 = local_12c;
                                if (local_12c == (stbi__gif_lzw)0x0) {
                                  local_128.prefix = -1;
                                  local_128.first = 0xff;
                                  local_128.suffix = '\x7f';
                                }
                                local_144.prefix = 0;
                                local_144.first = '\0';
                                local_144.suffix = '\0';
                              }
                              else {
                                unaff_RBP = 1;
                                bVar54 = false;
                              }
                            }
                          }
                        }
                        if (!bVar54) {
                          iVar11 = (int)unaff_RBP;
                          goto LAB_0010d63c;
                        }
                        iVar33 = iVar33 + 1;
                      } while (iVar33 != iVar13);
                    }
                    iVar11 = iVar11 + 1;
                  } while (iVar11 != iVar12);
                  iVar11 = 1;
                }
              }
              else {
                iVar11 = 1;
                if (0 < (int)local_2f4) {
                  unaff_RBP = 0;
                  do {
                    if (0 < (int)local_2f8) {
                      iVar12 = 0;
                      do {
                        if (0 < (int)local_140) {
                          lVar20 = 0;
                          do {
                            sVar4 = local_13c[lVar20];
                            lVar38 = (long)(int)sVar4;
                            if (0 < (int)auStack_2e4[lVar38 * 0x18 + 1]) {
                              iVar11 = 0;
                              bVar54 = true;
                              do {
                                local_4a10 = (stbi__int16 *)CONCAT71(local_4a10._1_7_,bVar54);
                                uVar41 = auStack_2e4[lVar38 * 0x18];
                                if (0 < (int)uVar41) {
                                  iVar13 = 0;
                                  do {
                                    iVar33 = stbi__jpeg_decode_block_prog_dc
                                                       ((stbi__jpeg *)local_4888,
                                                        (short *)((long)(int)((uVar41 * iVar12 +
                                                                               iVar13 + (auStack_2e4
                                                                                         [lVar38 * 
                                                  0x18 + 1] * (int)unaff_RBP + iVar11) *
                                                  (int)local_2b8[lVar38 * 0xc + 5]) * 0x40) * 2 +
                                                  local_2b8[lVar38 * 0xc + 4]),
                                                  (stbi__huffman *)
                                                  (local_4888 +
                                                  (long)(int)auStack_2e4[lVar38 * 0x18 + 3] * 0x690
                                                  + 8),(int)sVar4);
                                    if (iVar33 == 0) {
                                      if (bVar54 != false) goto LAB_0010d623;
                                      goto LAB_0010d2dd;
                                    }
                                    iVar13 = iVar13 + 1;
                                    uVar41 = auStack_2e4[lVar38 * 0x18];
                                  } while (iVar13 < (int)uVar41);
                                }
                                iVar11 = iVar11 + 1;
                                bVar54 = iVar11 < (int)auStack_2e4[lVar38 * 0x18 + 1];
                              } while (iVar11 < (int)auStack_2e4[lVar38 * 0x18 + 1]);
                            }
LAB_0010d2dd:
                            lVar20 = lVar20 + 1;
                          } while (lVar20 < (int)local_140);
                        }
                        sVar4 = local_128;
                        local_128 = (stbi__gif_lzw)((int)local_128 + -1);
                        if ((int)sVar4 < 2) {
                          if ((int)local_168._4_4_ < 0x18) {
                            stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                          }
                          iVar11 = 1;
                          if ((local_160 & 0xf8) != 0xd0) goto LAB_0010d63c;
                          local_168._0_2_ = 0;
                          local_168._2_1_ = '\0';
                          local_168._3_1_ = '\0';
                          local_168._4_2_ = 0;
                          local_168._6_1_ = '\0';
                          local_168._7_1_ = '\0';
                          local_15c.prefix = 0;
                          local_15c.first = '\0';
                          local_15c.suffix = '\0';
                          local_210.prefix = 0;
                          local_210.first = '\0';
                          local_210.suffix = '\0';
                          local_270.prefix = 0;
                          local_270.first = '\0';
                          local_270.suffix = '\0';
                          local_2d0.prefix = 0;
                          local_2d0.first = '\0';
                          local_2d0.suffix = '\0';
                          local_160 = 0xff;
                          local_128 = local_12c;
                          if (local_12c == (stbi__gif_lzw)0x0) {
                            local_128.prefix = -1;
                            local_128.first = 0xff;
                            local_128.suffix = '\x7f';
                          }
                          local_144.prefix = 0;
                          local_144.first = '\0';
                          local_144.suffix = '\0';
                        }
                        iVar12 = iVar12 + 1;
                      } while (iVar12 < (int)local_2f8);
                    }
                    iVar11 = 1;
                    uVar41 = (int)unaff_RBP + 1;
                    unaff_RBP = (ulong)uVar41;
                  } while ((int)uVar41 < (int)local_2f4);
                }
              }
              goto LAB_0010d63c;
            }
            stbi__g_failure_reason = "bad SOS len";
          }
          goto LAB_0010e1bf;
        }
        if (bVar9 == 0xd9) {
          if ((local_158 != (stbi__gif_lzw)0x0) && (0 < *(int *)(local_4888._0_8_ + 8))) {
            lVar20 = 0;
            do {
              iVar11 = local_2cc[lVar20 * 0x18 + 1] + 7 >> 3;
              if (0 < iVar11) {
                uVar41 = local_2cc[lVar20 * 0x18] + 7 >> 3;
                iVar12 = 0;
                do {
                  if (0 < (int)uVar41) {
                    uVar21 = 0;
                    do {
                      psVar50 = (short *)((long)(((int)local_2b8[lVar20 * 0xc + 5] * iVar12 +
                                                 (int)uVar21) * 0x40) * 2 +
                                         local_2b8[lVar20 * 0xc + 4]);
                      uVar37 = auStack_2e4[lVar20 * 0x18 + 2];
                      lVar38 = 0;
                      do {
                        psVar50[lVar38] =
                             (ushort)local_1400[lVar38 + (long)(int)uVar37 * 0x40] * psVar50[lVar38]
                        ;
                        lVar38 = lVar38 + 1;
                      } while (lVar38 != 0x40);
                      (*local_120)((stbi_uc *)
                                   ((long)(iVar12 * 8 * local_2cc[lVar20 * 0x18 + 2]) +
                                    local_2b8[lVar20 * 0xc] + uVar21 * 8),
                                   local_2cc[lVar20 * 0x18 + 2],psVar50);
                      uVar21 = uVar21 + 1;
                    } while (uVar21 != uVar41);
                  }
                  iVar12 = iVar12 + 1;
                } while (iVar12 != iVar11);
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 < *(int *)(local_4888._0_8_ + 8));
          }
          if (req_comp == 0) {
            req_comp = *(int *)(local_4888._0_8_ + 8);
          }
          uVar41 = *(int *)(local_4888._0_8_ + 8);
          uVar37 = 1;
          if (2 < req_comp) {
            uVar37 = uVar41;
          }
          if (uVar41 != 3) {
            uVar37 = uVar41;
          }
          if (0 < (int)uVar37) {
            lVar20 = 0;
            do {
              sVar5 = *(stbi__uint32 *)local_4888._0_8_;
              pvVar23 = malloc((ulong)(sVar5 + 3));
              *(void **)((long)local_2b8 + lVar20 * 2 + 0x18) = pvVar23;
              if (pvVar23 == (void *)0x0) {
                stbi__cleanup_jpeg((stbi__jpeg *)local_4888);
                stbi__g_failure_reason = "outofmem";
              }
              else {
                uVar21 = (long)(int)local_300 / (long)*(int *)((long)auStack_2e4 + lVar20 * 2);
                iVar11 = (int)uVar21;
                *(int *)((long)local_4930 + lVar20) = iVar11;
                iVar12 = (int)local_2fc / *(int *)((long)auStack_2e4 + lVar20 * 2 + 4);
                *(int *)((long)local_4930 + lVar20 + 4) = iVar12;
                *(int *)((long)local_4930 + lVar20 + 0xc) = iVar12 >> 1;
                *(int *)((long)local_4930 + lVar20 + 8) =
                     (int)((ulong)((iVar11 + sVar5) - 1) / (uVar21 & 0xffffffff));
                *(undefined4 *)((long)local_4930 + lVar20 + 0x10) = 0;
                uVar6 = *(undefined8 *)((long)local_2b8 + lVar20 * 2);
                *(undefined8 *)((long)local_4940 + lVar20 + 8) = uVar6;
                *(undefined8 *)((long)local_4940 + lVar20) = uVar6;
                if ((iVar11 == 1) && (iVar12 == 1)) {
                  *(code **)((long)local_4948 + lVar20) = resample_row_1;
                }
                else {
                  if ((iVar11 == 1) && (iVar12 == 2)) {
                    p_Var24 = stbi__resample_row_v_2;
                  }
                  else if ((iVar11 == 2) && (iVar12 == 1)) {
                    p_Var24 = stbi__resample_row_h_2;
                  }
                  else if ((iVar11 != 2) || (p_Var24 = local_110, iVar12 != 2)) {
                    p_Var24 = stbi__resample_row_generic;
                  }
                  *(_func_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int **)
                   ((long)local_4948 + lVar20) = p_Var24;
                }
              }
              if (pvVar23 == (void *)0x0) {
                return (uchar *)0x0;
              }
              lVar20 = lVar20 + 0x30;
            } while ((ulong)uVar37 * 0x30 != lVar20);
          }
          psVar29 = (stbi__context *)local_4888._0_8_;
          sVar5 = *(stbi__uint32 *)(local_4888._0_8_ + 4);
          puVar25 = (uchar *)malloc((ulong)(*(stbi__uint32 *)local_4888._0_8_ * req_comp * sVar5 + 1
                                           ));
          if (puVar25 != (uchar *)0x0) {
            if (sVar5 != 0) {
              iVar11 = 0;
              uVar41 = 0;
              do {
                sVar5 = psVar29->img_x;
                if (0 < (int)uVar37) {
                  piVar42 = local_4930 + 4;
                  piVar39 = local_2cc + 1;
                  uVar21 = 0;
                  do {
                    iVar12 = piVar42[-1];
                    iVar13 = piVar42[-3];
                    iVar33 = iVar13 >> 1;
                    psVar26 = (stbi_uc *)
                              (**(code **)(piVar42 + -10))
                                        (*(undefined8 *)(piVar39 + 10),
                                         *(undefined8 *)
                                          ((long)piVar42 +
                                          ((ulong)(iVar33 <= iVar12) << 3 | 0xffffffffffffffe0)),
                                         *(undefined8 *)
                                          ((long)piVar42 +
                                          ((ulong)(iVar12 < iVar33) << 3 | 0xffffffffffffffe0)),
                                         piVar42[-2],piVar42[-4]);
                    local_4968[uVar21] = psVar26;
                    piVar42[-1] = iVar12 + 1;
                    if (iVar13 <= iVar12 + 1) {
                      piVar42[-1] = 0;
                      *(long *)(piVar42 + -8) = *(long *)(piVar42 + -6);
                      iVar12 = *piVar42;
                      *piVar42 = iVar12 + 1;
                      if (iVar12 + 1 < *piVar39) {
                        *(long *)(piVar42 + -6) = *(long *)(piVar42 + -6) + (long)piVar39[1];
                      }
                    }
                    uVar21 = uVar21 + 1;
                    piVar39 = piVar39 + 0x18;
                    piVar42 = piVar42 + 0xc;
                  } while (uVar37 != uVar21);
                }
                if (req_comp < 3) {
                  if (req_comp == 1) {
                    if (*(stbi__uint32 *)local_4888._0_8_ != 0) {
                      uVar21 = 0;
                      do {
                        puVar25[uVar21 + sVar5 * iVar11] = local_4968[0][uVar21];
                        uVar21 = uVar21 + 1;
                      } while (uVar21 < *(stbi__uint32 *)local_4888._0_8_);
                    }
                  }
                  else if (*(stbi__uint32 *)local_4888._0_8_ != 0) {
                    uVar21 = 0;
                    do {
                      puVar25[uVar21 * 2 + (ulong)(sVar5 * iVar11)] = local_4968[0][uVar21];
                      puVar25[uVar21 * 2 + (ulong)(sVar5 * iVar11) + 1] = 0xff;
                      uVar21 = uVar21 + 1;
                    } while (uVar21 < *(stbi__uint32 *)local_4888._0_8_);
                  }
                }
                else if (*(int *)(local_4888._0_8_ + 8) == 3) {
                  (*local_118)(puVar25 + uVar41 * req_comp * sVar5,local_4968[0],local_4968[1],
                               local_4968[2],*(stbi__uint32 *)local_4888._0_8_,req_comp);
                }
                else if (*(stbi__uint32 *)local_4888._0_8_ != 0) {
                  puVar47 = puVar25 + (ulong)(sVar5 * iVar11) + 3;
                  uVar21 = 0;
                  do {
                    uVar2 = local_4968[0][uVar21];
                    puVar47[-1] = uVar2;
                    puVar47[-2] = uVar2;
                    puVar47[-3] = uVar2;
                    *puVar47 = 0xff;
                    uVar21 = uVar21 + 1;
                    puVar47 = puVar47 + (uint)req_comp;
                  } while (uVar21 < *(stbi__uint32 *)local_4888._0_8_);
                }
                uVar41 = uVar41 + 1;
                iVar11 = iVar11 + req_comp;
                psVar29 = (stbi__context *)local_4888._0_8_;
              } while (uVar41 < *(stbi__uint32 *)(local_4888._0_8_ + 4));
            }
            stbi__cleanup_jpeg((stbi__jpeg *)local_4888);
            *x = *(stbi__uint32 *)local_4888._0_8_;
            *y = *(stbi__uint32 *)(local_4888._0_8_ + 4);
            if (comp != (int *)0x0) {
              *comp = *(int *)(local_4888._0_8_ + 8);
              return puVar25;
            }
            return puVar25;
          }
          stbi__cleanup_jpeg((stbi__jpeg *)local_4888);
          goto LAB_0010e593;
        }
        iVar11 = stbi__process_marker((stbi__jpeg *)local_4888,(uint)bVar9);
      } while( true );
    }
LAB_0010d822:
    stbi__g_failure_reason = "bad req_comp";
    return (uchar *)0x0;
  }
  iVar11 = stbi__check_png_header(s);
  psVar26 = s->img_buffer_original;
  s->img_buffer = psVar26;
  if (iVar11 != 0) {
    if ((uint)req_comp < 5) {
      local_4888._0_8_ = s;
      iVar11 = stbi__parse_png_file((stbi__png *)local_4888,0,req_comp);
      puVar25 = local_4870;
      uVar6 = local_4888._0_8_;
      if (iVar11 == 0) {
        puVar25 = (uchar *)0x0;
      }
      else {
        local_4870 = (uchar *)0x0;
        if ((req_comp != 0) && (*(int *)(local_4888._0_8_ + 0xc) != req_comp)) {
          puVar25 = stbi__convert_format
                              (puVar25,*(int *)(local_4888._0_8_ + 0xc),req_comp,
                               *(stbi__uint32 *)local_4888._0_8_,
                               *(stbi__uint32 *)(local_4888._0_8_ + 4));
          *(int *)(uVar6 + 0xc) = req_comp;
          if (puVar25 == (uchar *)0x0) {
            return (uchar *)0x0;
          }
        }
        *x = *(stbi__uint32 *)local_4888._0_8_;
        *y = *(stbi__uint32 *)(local_4888._0_8_ + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(local_4888._0_8_ + 0xc);
        }
      }
      free(local_4870);
      local_4870 = (stbi_uc *)0x0;
      free(local_4878);
      local_4878 = (stbi_uc *)0x0;
      free((void *)local_4888._8_8_);
      return puVar25;
    }
    goto LAB_0010d822;
  }
  if (psVar26 < s->img_buffer_end) {
LAB_0010d9a7:
    s->img_buffer = psVar26 + 1;
    bVar54 = true;
    if (*psVar26 == 'B') {
      psVar26 = s->img_buffer;
      if (s->img_buffer_end <= psVar26) {
        if (s->read_from_callbacks == 0) goto LAB_0010dac3;
        psVar26 = s->buffer_start;
        iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
        if (iVar11 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar26;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar26;
          s->img_buffer_end = psVar26 + iVar11;
        }
        psVar26 = s->img_buffer;
      }
      s->img_buffer = psVar26 + 1;
      if (*psVar26 == 'M') {
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar41 = stbi__get16le(s);
        iVar11 = stbi__get16le(s);
        uVar41 = iVar11 << 0x10 | uVar41;
        if ((((0x38 < uVar41) ||
             (bVar54 = false, (0x100010000001000U >> ((ulong)uVar41 & 0x3f) & 1) == 0)) &&
            (bVar54 = false, uVar41 != 0x6c)) && (uVar41 != 0x7c)) goto LAB_0010dac0;
      }
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar26 = s->buffer_start;
      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
      if (iVar11 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar26;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar26;
        s->img_buffer_end = psVar26 + iVar11;
      }
      psVar26 = s->img_buffer;
      goto LAB_0010d9a7;
    }
LAB_0010dac0:
    bVar54 = true;
  }
LAB_0010dac3:
  psVar26 = s->img_buffer_original;
  s->img_buffer = psVar26;
  if (!bVar54) {
    if (s->img_buffer_end <= psVar26) {
      if (s->read_from_callbacks == 0) goto LAB_0010e355;
      psVar26 = s->buffer_start;
      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
      if (iVar11 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar26;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar26;
        s->img_buffer_end = psVar26 + iVar11;
      }
      psVar26 = s->img_buffer;
    }
    s->img_buffer = psVar26 + 1;
    if (*psVar26 != 'B') {
LAB_0010e355:
      stbi__g_failure_reason = "not BMP";
      return (uchar *)0x0;
    }
    psVar26 = s->img_buffer;
    if (s->img_buffer_end <= psVar26) {
      if (s->read_from_callbacks == 0) goto LAB_0010e355;
      psVar26 = s->buffer_start;
      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
      if (iVar11 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar26;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar26;
        s->img_buffer_end = psVar26 + iVar11;
      }
      psVar26 = s->img_buffer;
    }
    s->img_buffer = psVar26 + 1;
    if (*psVar26 != 'M') goto LAB_0010e355;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar41 = stbi__get16le(s);
    iVar11 = stbi__get16le(s);
    uVar37 = stbi__get16le(s);
    iVar12 = stbi__get16le(s);
    uVar37 = iVar12 << 0x10 | uVar37;
    if ((((0x38 < uVar37) || ((0x100010000001000U >> ((ulong)uVar37 & 0x3f) & 1) == 0)) &&
        (uVar37 != 0x6c)) && (uVar37 != 0x7c)) {
      stbi__g_failure_reason = "unknown BMP";
      return (uchar *)0x0;
    }
    uVar15 = stbi__get16le(s);
    if (uVar37 == 0xc) {
      s->img_x = uVar15;
      uVar15 = stbi__get16le(s);
    }
    else {
      iVar12 = stbi__get16le(s);
      s->img_x = iVar12 << 0x10 | uVar15;
      uVar15 = stbi__get16le(s);
      iVar12 = stbi__get16le(s);
      uVar15 = iVar12 << 0x10 | uVar15;
    }
    s->img_y = uVar15;
    iVar12 = stbi__get16le(s);
    if (iVar12 != 1) goto LAB_0010fbfd;
    uVar15 = stbi__get16le(s);
    if (uVar15 == 1) {
      stbi__g_failure_reason = "monochrome";
      return (uchar *)0x0;
    }
    uVar41 = iVar11 << 0x10 | uVar41;
    sVar5 = s->img_y;
    sVar17 = -sVar5;
    if (0 < (int)sVar5) {
      sVar17 = sVar5;
    }
    s->img_y = sVar17;
    if (uVar37 == 0xc) {
      if (uVar15 < 0x18) {
        uVar35 = (int)(uVar41 - 0x26) / 3;
      }
      else {
        uVar35 = 0;
      }
      uVar36 = 0;
      uVar40 = 0;
      uVar48 = 0;
      uVar49 = 0;
    }
    else {
      uVar40 = stbi__get16le(s);
      iVar11 = stbi__get16le(s);
      if ((iVar11 * 0x10000 + uVar40) - 1 < 2) {
        stbi__g_failure_reason = "BMP RLE";
        return (uchar *)0x0;
      }
      stbi__get32le(s);
      stbi__get32le(s);
      stbi__get32le(s);
      stbi__get32le(s);
      stbi__get32le(s);
      if (uVar37 == 0x28) {
LAB_0010e5f7:
        uVar36 = 0;
        if ((uVar15 == 0x20) || (uVar15 == 0x10)) {
          uVar40 = iVar11 * 0x10000 | uVar40;
          if (uVar40 == 3) {
            uVar49 = stbi__get32le(s);
            uVar48 = stbi__get32le(s);
            uVar40 = stbi__get32le(s);
            if (uVar48 == uVar40 && uVar49 == uVar48) goto LAB_0010fbfd;
            uVar36 = 0;
          }
          else {
            if (uVar40 != 0) {
LAB_0010fbfd:
              stbi__g_failure_reason = "bad BMP";
              return (uchar *)0x0;
            }
            bVar54 = uVar15 != 0x20;
            uVar40 = 0x1f;
            if (!bVar54) {
              uVar40 = 0xff;
            }
            uVar48 = 0x3e0;
            if (!bVar54) {
              uVar48 = 0xff00;
            }
            uVar49 = 0x7c00;
            if (!bVar54) {
              uVar49 = 0xff0000;
            }
            uVar36 = (uint)bVar54 * 0x1000000 - 0x1000000;
          }
        }
        else {
          uVar40 = 0;
          uVar48 = 0;
          uVar49 = 0;
        }
      }
      else {
        if (uVar37 == 0x38) {
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
          goto LAB_0010e5f7;
        }
        uVar49 = stbi__get32le(s);
        uVar48 = stbi__get32le(s);
        uVar40 = stbi__get32le(s);
        uVar36 = stbi__get32le(s);
        stbi__get32le(s);
        iVar11 = 0xc;
        do {
          stbi__get16le(s);
          stbi__get16le(s);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        if (uVar37 == 0x7c) {
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
        }
      }
      uVar35 = 0;
      if (uVar15 < 0x10) {
        uVar35 = (int)((uVar41 - uVar37) + -0xe) >> 2;
      }
    }
    iVar11 = 4 - (uint)(uVar36 == 0);
    s->img_n = iVar11;
    if (2 < req_comp) {
      iVar11 = req_comp;
    }
    data_00 = (stbi__context *)malloc((ulong)(s->img_x * iVar11 * s->img_y));
    if (data_00 == (stbi__context *)0x0) {
LAB_0010e593:
      stbi__g_failure_reason = "outofmem";
      return (uchar *)0x0;
    }
    if (uVar15 < 0x10) {
      if (0x100 < (int)uVar35 || uVar35 == 0) {
        free(data_00);
        stbi__g_failure_reason = "invalid";
        return (uchar *)0x0;
      }
      if (0 < (int)uVar35) {
        psVar26 = s->buffer_start;
        psVar1 = s->buffer_start + 1;
        uVar21 = 0;
        do {
          psVar27 = s->img_buffer;
          if (psVar27 < s->img_buffer_end) {
LAB_0010e84d:
            s->img_buffer = psVar27 + 1;
            sVar8 = *psVar27;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
              if (iVar12 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar26;
                s->img_buffer_end = psVar1;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar26;
                s->img_buffer_end = psVar26 + iVar12;
              }
              psVar27 = s->img_buffer;
              goto LAB_0010e84d;
            }
            sVar8 = '\0';
          }
          local_4888[uVar21 * 4 + 2] = sVar8;
          psVar27 = s->img_buffer;
          if (psVar27 < s->img_buffer_end) {
LAB_0010e8da:
            s->img_buffer = psVar27 + 1;
            sVar8 = *psVar27;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
              if (iVar12 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar26;
                s->img_buffer_end = psVar1;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar26;
                s->img_buffer_end = psVar26 + iVar12;
              }
              psVar27 = s->img_buffer;
              goto LAB_0010e8da;
            }
            sVar8 = '\0';
          }
          local_4888[uVar21 * 4 + 1] = sVar8;
          psVar27 = s->img_buffer;
          if (psVar27 < s->img_buffer_end) {
LAB_0010e967:
            s->img_buffer = psVar27 + 1;
            sVar8 = *psVar27;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
              if (iVar12 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar26;
                s->img_buffer_end = psVar1;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar26;
                s->img_buffer_end = psVar26 + iVar12;
              }
              psVar27 = s->img_buffer;
              goto LAB_0010e967;
            }
            sVar8 = '\0';
          }
          local_4888[uVar21 * 4] = sVar8;
          if (uVar37 != 0xc) {
            psVar27 = s->img_buffer;
            if (s->img_buffer_end <= psVar27) {
              if (s->read_from_callbacks == 0) goto LAB_0010ea01;
              iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
              if (iVar12 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar26;
                s->img_buffer_end = psVar1;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar26;
                s->img_buffer_end = psVar26 + iVar12;
              }
              psVar27 = s->img_buffer;
            }
            s->img_buffer = psVar27 + 1;
          }
LAB_0010ea01:
          local_4888[uVar21 * 4 + 3] = 0xff;
          uVar21 = uVar21 + 1;
        } while (uVar35 != uVar21);
      }
      stbi__skip(s,(uVar41 - uVar37) + uVar35 * (uVar37 == 0xc | 0xfffffffc) + -0xe);
      if (uVar15 == 4) {
        uVar41 = s->img_x + 1 >> 1;
      }
      else {
        if (uVar15 != 8) {
          free(data_00);
          stbi__g_failure_reason = "bad bpp";
          return (uchar *)0x0;
        }
        uVar41 = s->img_x;
      }
      if (0 < (int)s->img_y) {
        local_49f0 = -uVar41 & 3;
        psVar26 = s->buffer_start;
        uVar21 = 0;
        iVar12 = 0;
        do {
          if (0 < (int)s->img_x) {
            iVar13 = 0;
            do {
              pbVar28 = s->img_buffer;
              if (pbVar28 < s->img_buffer_end) {
LAB_0010f90a:
                s->img_buffer = pbVar28 + 1;
                uVar41 = (uint)*pbVar28;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar33 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                  if (iVar33 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar26;
                    s->img_buffer_end = s->buffer_start + 1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar26;
                    s->img_buffer_end = psVar26 + iVar33;
                  }
                  pbVar28 = s->img_buffer;
                  goto LAB_0010f90a;
                }
                uVar41 = 0;
              }
              uVar37 = uVar41 >> 4;
              if (uVar15 != 4) {
                uVar37 = uVar41;
              }
              uVar22 = (ulong)uVar37;
              uVar41 = uVar41 & 0xf;
              if (uVar15 != 4) {
                uVar41 = 0;
              }
              lVar20 = (long)(int)uVar21;
              uVar43 = lVar20 + 3;
              data_00->buffer_start[lVar20 + -0x38] = local_4888[uVar22 * 4];
              data_00->buffer_start[lVar20 + -0x37] = local_4888[uVar22 * 4 + 1];
              data_00->buffer_start[lVar20 + -0x36] = local_4888[uVar22 * 4 + 2];
              if (iVar11 == 4) {
                data_00->buffer_start[lVar20 + -0x35] = 0xff;
                uVar43 = (ulong)((int)uVar21 + 4);
              }
              sVar17 = s->img_x;
              if (iVar13 + 1U == sVar17) {
LAB_0010fa54:
                uVar21 = uVar43 & 0xffffffff;
              }
              else {
                if (uVar15 == 8) {
                  pbVar28 = s->img_buffer;
                  if (s->img_buffer_end <= pbVar28) {
                    if (s->read_from_callbacks == 0) {
                      uVar41 = 0;
                      goto LAB_0010fa1d;
                    }
                    iVar33 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                    if (iVar33 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar26;
                      s->img_buffer_end = s->buffer_start + 1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar26;
                      s->img_buffer_end = psVar26 + iVar33;
                    }
                    pbVar28 = s->img_buffer;
                  }
                  s->img_buffer = pbVar28 + 1;
                  uVar41 = (uint)*pbVar28;
                }
LAB_0010fa1d:
                lVar20 = (long)(int)uVar43;
                uVar21 = lVar20 + 3;
                uVar22 = (ulong)uVar41;
                data_00->buffer_start[lVar20 + -0x38] = local_4888[uVar22 * 4];
                data_00->buffer_start[lVar20 + -0x37] = local_4888[uVar22 * 4 + 1];
                data_00->buffer_start[lVar20 + -0x36] = local_4888[uVar22 * 4 + 2];
                if (iVar11 == 4) {
                  uVar43 = (ulong)((int)uVar43 + 4);
                  data_00->buffer_start[lVar20 + -0x35] = 0xff;
                  goto LAB_0010fa54;
                }
              }
            } while ((iVar13 + 1U != sVar17) && (iVar13 = iVar13 + 2, iVar13 < (int)s->img_x));
          }
          stbi__skip(s,local_49f0);
          iVar12 = iVar12 + 1;
        } while (iVar12 < (int)s->img_y);
      }
    }
    else {
      stbi__skip(s,(uVar41 - uVar37) + -0xe);
      iVar12 = -3;
      if (uVar15 == 0x18) {
LAB_0010e735:
        local_4994 = iVar12 * s->img_x & 3;
      }
      else {
        local_4994 = 0;
        iVar12 = -2;
        if (uVar15 == 0x10) goto LAB_0010e735;
      }
      local_49b4 = 0;
      bVar54 = false;
      bVar53 = false;
      if (uVar15 != 0x18) {
        if (uVar15 == 0x20) {
          bVar53 = uVar36 == 0xff000000 &&
                   (uVar49 == 0xff0000 && (uVar48 == 0xff00 && uVar40 == 0xff));
          bVar54 = uVar36 != 0xff000000 ||
                   (uVar49 != 0xff0000 || (uVar48 != 0xff00 || uVar40 != 0xff));
        }
        else {
          bVar54 = true;
          bVar53 = false;
        }
      }
      local_49b8 = 0;
      local_49bc = 0;
      local_49a0 = 0;
      uVar41 = 0;
      uVar37 = 0;
      uVar35 = 0;
      uVar18 = 0;
      if (bVar54) {
        if (((uVar40 == 0) || (uVar48 == 0)) || (uVar49 == 0)) {
          free(data_00);
          stbi__g_failure_reason = "bad masks";
          return (uchar *)0x0;
        }
        local_49b4 = stbi__high_bit(uVar49);
        local_49b4 = local_49b4 + -7;
        uVar41 = stbi__bitcount(uVar49);
        local_49b8 = stbi__high_bit(uVar48);
        local_49b8 = local_49b8 + -7;
        uVar37 = stbi__bitcount(uVar48);
        local_49bc = stbi__high_bit(uVar40);
        local_49bc = local_49bc + -7;
        uVar35 = stbi__bitcount(uVar40);
        local_49a0 = stbi__high_bit(uVar36);
        local_49a0 = local_49a0 + -7;
        uVar18 = stbi__bitcount(uVar36);
      }
      if (0 < (int)s->img_y) {
        psVar26 = s->buffer_start;
        psVar1 = s->buffer_start + 1;
        uVar21 = 0;
        iVar12 = 0;
        do {
          if (bVar54) {
            if ((int)s->img_x < 1) {
LAB_0010f7e9:
              uVar19 = (uint)uVar21;
            }
            else {
              iVar13 = 0;
              do {
                uVar19 = stbi__get16le(s);
                if (uVar15 != 0x10) {
                  iVar33 = stbi__get16le(s);
                  uVar19 = uVar19 | iVar33 << 0x10;
                }
                iVar33 = (int)(uVar19 & uVar49) >> ((byte)local_49b4 & 0x1f);
                if (local_49b4 < 0) {
                  iVar33 = (uVar19 & uVar49) << (-(byte)local_49b4 & 0x1f);
                }
                uVar34 = uVar41;
                iVar14 = iVar33;
                if (uVar41 < 8) {
                  do {
                    iVar14 = iVar14 + (iVar33 >> ((byte)uVar34 & 0x1f));
                    sVar8 = (stbi_uc)iVar14;
                    uVar34 = uVar34 + uVar41;
                  } while (uVar34 < 8);
                }
                else {
                  sVar8 = (stbi_uc)iVar33;
                }
                iVar33 = (int)(uVar19 & uVar48) >> ((byte)local_49b8 & 0x1f);
                if (local_49b8 < 0) {
                  iVar33 = (uVar19 & uVar48) << (-(byte)local_49b8 & 0x1f);
                }
                lVar20 = (long)(int)uVar21;
                data_00->buffer_start[lVar20 + -0x38] = sVar8;
                uVar34 = uVar37;
                iVar14 = iVar33;
                if (uVar37 < 8) {
                  do {
                    iVar14 = iVar14 + (iVar33 >> ((byte)uVar34 & 0x1f));
                    sVar8 = (stbi_uc)iVar14;
                    uVar34 = uVar34 + uVar37;
                  } while (uVar34 < 8);
                }
                else {
                  sVar8 = (stbi_uc)iVar33;
                }
                iVar33 = (int)(uVar19 & uVar40) >> ((byte)local_49bc & 0x1f);
                if (local_49bc < 0) {
                  iVar33 = (uVar19 & uVar40) << (-(byte)local_49bc & 0x1f);
                }
                data_00->buffer_start[lVar20 + -0x37] = sVar8;
                uVar34 = uVar35;
                iVar14 = iVar33;
                if (uVar35 < 8) {
                  do {
                    iVar14 = iVar14 + (iVar33 >> ((byte)uVar34 & 0x1f));
                    sVar8 = (stbi_uc)iVar14;
                    uVar34 = uVar34 + uVar35;
                  } while (uVar34 < 8);
                }
                else {
                  sVar8 = (stbi_uc)iVar33;
                }
                data_00->buffer_start[lVar20 + -0x36] = sVar8;
                if (uVar36 == 0) {
                  sVar8 = 0xff;
                }
                else {
                  iVar33 = (int)(uVar19 & uVar36) >> ((byte)local_49a0 & 0x1f);
                  if (local_49a0 < 0) {
                    iVar33 = (uVar19 & uVar36) << (-(byte)local_49a0 & 0x1f);
                  }
                  uVar19 = uVar18;
                  iVar14 = iVar33;
                  if (uVar18 < 8) {
                    do {
                      iVar14 = iVar14 + (iVar33 >> ((byte)uVar19 & 0x1f));
                      sVar8 = (stbi_uc)iVar14;
                      uVar19 = uVar19 + uVar18;
                    } while (uVar19 < 8);
                  }
                  else {
                    sVar8 = (stbi_uc)iVar33;
                  }
                }
                uVar22 = lVar20 + 3;
                if (iVar11 == 4) {
                  data_00->buffer_start[lVar20 + -0x35] = sVar8;
                  uVar22 = (ulong)((int)uVar21 + 4);
                }
                iVar13 = iVar13 + 1;
                uVar19 = (uint)uVar22;
                uVar21 = uVar22 & 0xffffffff;
              } while (iVar13 < (int)s->img_x);
            }
          }
          else {
            if ((int)s->img_x < 1) goto LAB_0010f7e9;
            iVar13 = 0;
            do {
              psVar27 = s->img_buffer;
              if (psVar27 < s->img_buffer_end) {
LAB_0010f5be:
                s->img_buffer = psVar27 + 1;
                sVar8 = *psVar27;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar33 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                  if (iVar33 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar26;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar26;
                    s->img_buffer_end = psVar26 + iVar33;
                  }
                  psVar27 = s->img_buffer;
                  goto LAB_0010f5be;
                }
                sVar8 = '\0';
              }
              lVar20 = (long)(int)uVar21;
              data_00->buffer_start[lVar20 + -0x36] = sVar8;
              psVar27 = s->img_buffer;
              if (psVar27 < s->img_buffer_end) {
LAB_0010f663:
                s->img_buffer = psVar27 + 1;
                sVar8 = *psVar27;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar33 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                  if (iVar33 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar26;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar26;
                    s->img_buffer_end = psVar26 + iVar33;
                  }
                  psVar27 = s->img_buffer;
                  goto LAB_0010f663;
                }
                sVar8 = '\0';
              }
              data_00->buffer_start[lVar20 + -0x37] = sVar8;
              psVar27 = s->img_buffer;
              if (psVar27 < s->img_buffer_end) {
LAB_0010f705:
                s->img_buffer = psVar27 + 1;
                sVar8 = *psVar27;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar33 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                  if (iVar33 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar26;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar26;
                    s->img_buffer_end = psVar26 + iVar33;
                  }
                  psVar27 = s->img_buffer;
                  goto LAB_0010f705;
                }
                sVar8 = '\0';
              }
              data_00->buffer_start[lVar20 + -0x38] = sVar8;
              sVar8 = 0xff;
              if (bVar53) {
                psVar27 = s->img_buffer;
                if (s->img_buffer_end <= psVar27) {
                  if (s->read_from_callbacks == 0) {
                    sVar8 = '\0';
                    goto LAB_0010f7c4;
                  }
                  iVar33 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                  if (iVar33 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar26;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar26;
                    s->img_buffer_end = psVar26 + iVar33;
                  }
                  psVar27 = s->img_buffer;
                }
                s->img_buffer = psVar27 + 1;
                sVar8 = *psVar27;
              }
LAB_0010f7c4:
              uVar22 = lVar20 + 3;
              if (iVar11 == 4) {
                data_00->buffer_start[lVar20 + -0x35] = sVar8;
                uVar22 = (ulong)((int)uVar21 + 4);
              }
              iVar13 = iVar13 + 1;
              uVar19 = (uint)uVar22;
              uVar21 = uVar22 & 0xffffffff;
            } while (iVar13 < (int)s->img_x);
          }
          stbi__skip(s,local_4994);
          iVar12 = iVar12 + 1;
          uVar21 = (ulong)uVar19;
        } while (iVar12 < (int)s->img_y);
      }
    }
    if (0 < (int)sVar5) {
      uVar41 = (int)s->img_y >> 1;
      if (0 < (int)uVar41) {
        uVar15 = s->img_x * iVar11;
        uVar37 = (s->img_y - 1) * uVar15;
        uVar21 = 0;
        uVar22 = 0;
        do {
          if (0 < (int)uVar15) {
            uVar43 = 0;
            do {
              sVar8 = data_00->buffer_start[uVar43 + uVar21 + -0x38];
              data_00->buffer_start[uVar43 + uVar21 + -0x38] =
                   data_00->buffer_start[uVar43 + uVar37 + -0x38];
              data_00->buffer_start[uVar43 + uVar37 + -0x38] = sVar8;
              uVar43 = uVar43 + 1;
            } while (uVar15 != uVar43);
          }
          uVar22 = uVar22 + 1;
          uVar37 = uVar37 - uVar15;
          uVar21 = (ulong)((int)uVar21 + uVar15);
        } while (uVar22 != uVar41);
      }
    }
    if (((req_comp != 0) && (iVar11 != req_comp)) &&
       (data_00 = (stbi__context *)
                  stbi__convert_format((uchar *)data_00,iVar11,req_comp,s->img_x,s->img_y),
       data_00 == (stbi__context *)0x0)) {
      return (uchar *)0x0;
    }
    *x = s->img_x;
    *y = s->img_y;
    if (comp == (int *)0x0) {
      return (uchar *)data_00;
    }
    local_4888._4_4_ = s->img_n;
    y = comp;
    goto LAB_0010fbc1;
  }
  if (psVar26 < s->img_buffer_end) {
LAB_0010dba3:
    s->img_buffer = psVar26 + 1;
    if (*psVar26 == 'G') {
      psVar26 = s->img_buffer;
      if (s->img_buffer_end <= psVar26) {
        if (s->read_from_callbacks == 0) goto LAB_0010eaf4;
        psVar26 = s->buffer_start;
        iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
        if (iVar11 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar26;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar26;
          s->img_buffer_end = psVar26 + iVar11;
        }
        psVar26 = s->img_buffer;
      }
      s->img_buffer = psVar26 + 1;
      if (*psVar26 == 'I') {
        psVar26 = s->img_buffer;
        if (s->img_buffer_end <= psVar26) {
          if (s->read_from_callbacks == 0) goto LAB_0010eaf4;
          psVar26 = s->buffer_start;
          iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
          if (iVar11 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar26;
            s->img_buffer_end = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar26;
            s->img_buffer_end = psVar26 + iVar11;
          }
          psVar26 = s->img_buffer;
        }
        s->img_buffer = psVar26 + 1;
        if (*psVar26 == 'F') {
          psVar26 = s->img_buffer;
          if (s->img_buffer_end <= psVar26) {
            if (s->read_from_callbacks == 0) goto LAB_0010eaf4;
            psVar26 = s->buffer_start;
            iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
            if (iVar11 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar26;
              s->img_buffer_end = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar26;
              s->img_buffer_end = psVar26 + iVar11;
            }
            psVar26 = s->img_buffer;
          }
          s->img_buffer = psVar26 + 1;
          if (*psVar26 == '8') {
            psVar26 = s->img_buffer;
            if (psVar26 < s->img_buffer_end) {
LAB_0010ea83:
              s->img_buffer = psVar26 + 1;
              sVar8 = *psVar26;
            }
            else {
              if (s->read_from_callbacks != 0) {
                psVar26 = s->buffer_start;
                iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                if (iVar11 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar26;
                  s->img_buffer_end = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar26;
                  s->img_buffer_end = psVar26 + iVar11;
                }
                psVar26 = s->img_buffer;
                goto LAB_0010ea83;
              }
              sVar8 = '\0';
            }
            if ((sVar8 == '9') || (sVar8 == '7')) {
              psVar26 = s->img_buffer;
              if (s->img_buffer_end <= psVar26) {
                if (s->read_from_callbacks == 0) goto LAB_0010eaf4;
                psVar26 = s->buffer_start;
                iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                if (iVar11 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar26;
                  s->img_buffer_end = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar26;
                  s->img_buffer_end = psVar26 + iVar11;
                }
                psVar26 = s->img_buffer;
              }
              s->img_buffer = psVar26 + 1;
              sVar8 = *psVar26;
              s->img_buffer = s->img_buffer_original;
              if (sVar8 != 'a') goto LAB_0010eb04;
              memset(local_4888,0,0x4858);
              uVar6 = local_4888._8_8_;
              if ((stbi__context *)local_4888._8_8_ == (stbi__context *)0x0) {
                iVar11 = stbi__gif_header(s,(stbi__gif *)local_4888,comp,0);
                psVar29 = (stbi__context *)0x0;
                if (iVar11 != 0) {
                  sVar51 = (long)(int)local_4888._4_4_ * (long)(int)local_4888._0_4_ * 4;
                  local_4888._8_8_ = malloc(sVar51);
                  if ((stbi__context *)local_4888._8_8_ == (stbi__context *)0x0) goto LAB_0010fb82;
                  if (0 < (int)sVar51) {
                    lVar20 = (long)local_4878._4_4_;
                    lVar38 = 0;
                    do {
                      ((stbi__context *)local_4888._8_8_)->buffer_start[lVar38 + -0x38] =
                           local_4864[lVar20 * 4 + 2];
                      ((stbi__context *)local_4888._8_8_)->buffer_start[lVar38 + -0x37] =
                           local_4864[lVar20 * 4 + 1];
                      ((stbi__context *)local_4888._8_8_)->buffer_start[lVar38 + -0x36] =
                           local_4864[lVar20 * 4];
                      ((stbi__context *)local_4888._8_8_)->buffer_start[lVar38 + -0x35] =
                           local_4864[lVar20 * 4 + 3];
                      lVar38 = lVar38 + 4;
                    } while (lVar38 < local_4888._0_4_ * local_4888._4_4_ * 4);
                  }
                  goto LAB_0010ee4f;
                }
              }
              else {
                if ((local_4868 & 0x1c) == 0xc) {
                  sVar51 = (long)(int)local_4888._4_4_ * (long)(int)local_4888._0_4_ * 4;
                  local_4888._8_8_ = malloc(sVar51);
                  if ((stbi__context *)local_4888._8_8_ != (stbi__context *)0x0) {
                    memcpy((void *)local_4888._8_8_,(void *)uVar6,sVar51);
                    goto LAB_0010ee4f;
                  }
LAB_0010fb82:
                  stbi__g_failure_reason = "outofmem";
                }
                else {
LAB_0010ee4f:
                  psVar26 = s->buffer_start;
                  psVar1 = s->buffer_start + 1;
LAB_0010ee59:
                  psVar27 = s->img_buffer;
                  if (psVar27 < s->img_buffer_end) {
LAB_0010eecb:
                    s->img_buffer = psVar27 + 1;
                    sVar8 = *psVar27;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                      if (iVar11 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar26;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar26;
                        s->img_buffer_end = psVar26 + iVar11;
                      }
                      psVar27 = s->img_buffer;
                      goto LAB_0010eecb;
                    }
                    sVar8 = '\0';
                  }
                  if (sVar8 == '!') {
                    psVar27 = s->img_buffer;
                    if (s->img_buffer_end <= psVar27) {
                      if (s->read_from_callbacks == 0) goto LAB_0010f121;
                      iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                      if (iVar11 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar26;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar26;
                        s->img_buffer_end = psVar26 + iVar11;
                      }
                      psVar27 = s->img_buffer;
                    }
                    s->img_buffer = psVar27 + 1;
                    if (*psVar27 != 0xf9) goto LAB_0010f121;
                    pbVar28 = s->img_buffer;
                    if (pbVar28 < s->img_buffer_end) {
LAB_0010efda:
                      s->img_buffer = pbVar28 + 1;
                      bVar9 = *pbVar28;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                        if (iVar11 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar26;
                          s->img_buffer_end = psVar1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar26;
                          s->img_buffer_end = psVar26 + iVar11;
                        }
                        pbVar28 = s->img_buffer;
                        goto LAB_0010efda;
                      }
                      bVar9 = 0;
                    }
                    if (bVar9 == 4) {
                      pbVar28 = s->img_buffer;
                      if (pbVar28 < s->img_buffer_end) {
LAB_0010f06e:
                        s->img_buffer = pbVar28 + 1;
                        local_4868 = (uint)*pbVar28;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                          if (iVar11 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar26;
                            s->img_buffer_end = psVar1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar26;
                            s->img_buffer_end = psVar26 + iVar11;
                          }
                          pbVar28 = s->img_buffer;
                          goto LAB_0010f06e;
                        }
                        local_4868 = 0;
                      }
                      stbi__get16le(s);
                      pbVar28 = s->img_buffer;
                      if (pbVar28 < s->img_buffer_end) {
LAB_0010f0fe:
                        s->img_buffer = pbVar28 + 1;
                        uVar41 = (uint)*pbVar28;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                          if (iVar11 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar26;
                            s->img_buffer_end = psVar1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar26;
                            s->img_buffer_end = psVar26 + iVar11;
                          }
                          pbVar28 = s->img_buffer;
                          goto LAB_0010f0fe;
                        }
                        uVar41 = 0;
                      }
                      local_4870 = (uchar *)CONCAT44(uVar41,(int)local_4870);
LAB_0010f121:
                      do {
                        pbVar28 = s->img_buffer;
                        if (pbVar28 < s->img_buffer_end) {
LAB_0010f193:
                          s->img_buffer = pbVar28 + 1;
                          bVar9 = *pbVar28;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                            if (iVar11 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar26;
                              s->img_buffer_end = psVar1;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar26;
                              s->img_buffer_end = psVar26 + iVar11;
                            }
                            pbVar28 = s->img_buffer;
                            goto LAB_0010f193;
                          }
                          bVar9 = 0;
                        }
                        if (bVar9 == 0) goto LAB_0010ee59;
                        stbi__skip(s,(uint)bVar9);
                      } while( true );
                    }
                    stbi__skip(s,(uint)bVar9);
                    goto LAB_0010ee59;
                  }
                  psVar29 = s;
                  if (sVar8 == ';') goto LAB_0010fb92;
                  if (sVar8 != ',') {
                    stbi__g_failure_reason = "unknown code";
                    goto LAB_0010fb90;
                  }
                  iVar11 = stbi__get16le(s);
                  iVar12 = stbi__get16le(s);
                  iVar13 = stbi__get16le(s);
                  iVar33 = stbi__get16le(s);
                  if (iVar13 + iVar11 <= (int)local_4888._0_4_) {
                    if (iVar33 + iVar12 <= (int)local_4888._4_4_) {
                      local_34 = local_4888._0_4_ * 4;
                      local_4c = iVar11 << 2;
                      local_48 = iVar12 * local_34;
                      local_44 = (iVar13 + iVar11) * 4;
                      local_40 = local_34 * (iVar33 + iVar12);
                      local_3c = iVar11 << 2;
                      local_38 = iVar12 * local_34;
                      pbVar28 = s->img_buffer;
                      if (pbVar28 < s->img_buffer_end) {
LAB_0010fcfc:
                        s->img_buffer = pbVar28 + 1;
                        local_50 = (uint)*pbVar28;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                          if (iVar11 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar26;
                            s->img_buffer_end = psVar1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar26;
                            s->img_buffer_end = psVar26 + iVar11;
                          }
                          pbVar28 = s->img_buffer;
                          goto LAB_0010fcfc;
                        }
                        local_50 = 0;
                      }
                      local_54 = local_34 * 8;
                      if ((local_50 & 0x40) == 0) {
                        local_54 = local_34;
                      }
                      local_58 = (int)(local_50 << 0x19) >> 0x1f & 3;
                      if ((char)(byte)local_50 < '\0') {
                        pal = (stbi_uc (*) [4])(local_4864 + 0x400);
                        stbi__gif_parse_colortable
                                  (s,pal,2 << ((byte)local_50 & 7),
                                   -(uint)((local_4868 & 1) == 0) | local_4870._4_4_);
                      }
                      else {
                        if (((ulong)local_4878 & 0x80) == 0) {
                          stbi__g_failure_reason = "missing color table";
                          goto LAB_0010fb90;
                        }
                        pal = (stbi_uc (*) [4])local_4864;
                        lVar20 = 0;
                        do {
                          local_4864[lVar20 * 4 + 3] = 0xff;
                          lVar20 = lVar20 + 1;
                        } while (lVar20 != 0x100);
                        if ((-1 < (long)(int)local_4870._4_4_) && ((local_4868 & 1) != 0)) {
                          local_4864[(long)(int)local_4870._4_4_ * 4 + 3] = '\0';
                        }
                      }
                      local_60 = pal;
                      pbVar28 = s->img_buffer;
                      if (pbVar28 < s->img_buffer_end) {
LAB_0010fe47:
                        s->img_buffer = pbVar28 + 1;
                        bVar9 = *pbVar28;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                          if (iVar11 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar26;
                            s->img_buffer_end = psVar1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar26;
                            s->img_buffer_end = psVar26 + iVar11;
                          }
                          pbVar28 = s->img_buffer;
                          goto LAB_0010fe47;
                        }
                        bVar9 = 0;
                      }
                      if (bVar9 < 0xd) {
                        uVar41 = 1 << (bVar9 & 0x1f);
                        uVar21 = 0;
                        do {
                          *(undefined2 *)(auStack_4062 + uVar21 * 4 + -2) = 0xffff;
                          auStack_4062[uVar21 * 4] = (char)uVar21;
                          auStack_4062[uVar21 * 4 + 1] = (char)uVar21;
                          uVar21 = uVar21 + 1;
                        } while (uVar41 != uVar21);
                        uVar36 = (2 << (bVar9 & 0x1f)) - 1;
                        uVar48 = 0;
                        iVar12 = 0;
                        uVar40 = 0;
                        local_4a00 = uVar36;
                        uVar37 = uVar41 + 2;
                        uVar15 = 0xffffffff;
                        bVar54 = true;
                        iVar11 = bVar9 + 1;
LAB_0010fef3:
                        do {
                          iVar13 = iVar12 - iVar11;
                          if (iVar11 <= iVar12) {
                            bVar31 = (byte)iVar11;
                            uVar49 = uVar40 & local_4a00;
                            bVar53 = true;
                            bVar30 = false;
                            if (uVar49 == uVar41) {
                              uVar49 = 0xffffffff;
                              local_4a00 = uVar36;
                              iVar11 = bVar9 + 1;
                              uVar37 = uVar41 + 2;
                            }
                            else {
                              if (uVar49 == uVar41 + 1) {
                                do {
                                  stbi__skip(s,uVar48);
                                  pbVar28 = s->img_buffer;
                                  if (pbVar28 < s->img_buffer_end) {
LAB_00110112:
                                    s->img_buffer = pbVar28 + 1;
                                    bVar10 = *pbVar28;
                                  }
                                  else {
                                    if (s->read_from_callbacks != 0) {
                                      iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar26,
                                                               s->buflen);
                                      if (iVar12 == 0) {
                                        s->read_from_callbacks = 0;
                                        s->img_buffer = psVar26;
                                        s->img_buffer_end = psVar1;
                                        s->buffer_start[0] = '\0';
                                      }
                                      else {
                                        s->img_buffer = psVar26;
                                        s->img_buffer_end = psVar26 + iVar12;
                                      }
                                      pbVar28 = s->img_buffer;
                                      goto LAB_00110112;
                                    }
                                    bVar10 = 0;
                                  }
                                  if (bVar10 == 0) goto LAB_00110156;
                                  uVar48 = (uint)bVar10;
                                } while( true );
                              }
                              if ((int)uVar37 < (int)uVar49) {
                                stbi__g_failure_reason = "illegal code in raster";
                              }
                              else if (bVar54) {
                                stbi__g_failure_reason = "no clear code";
                                bVar54 = true;
                              }
                              else {
                                if ((int)uVar15 < 0) {
                                  if (uVar49 != uVar37) goto LAB_00110284;
                                  stbi__g_failure_reason = "illegal code in raster";
                                }
                                else {
                                  uVar35 = uVar37 + 1;
                                  if ((int)uVar37 < 0x1000) {
                                    lVar20 = (long)(int)uVar37;
                                    *(short *)(auStack_4062 + lVar20 * 4 + -2) = (short)uVar15;
                                    uVar32 = auStack_4062[(ulong)uVar15 * 4];
                                    auStack_4062[lVar20 * 4] = uVar32;
                                    if (uVar49 != uVar35) {
                                      uVar32 = auStack_4062[(long)(int)uVar49 * 4];
                                    }
                                    auStack_4062[lVar20 * 4 + 1] = uVar32;
                                    uVar37 = uVar35;
LAB_00110284:
                                    stbi__out_gif_code((stbi__gif *)local_4888,(stbi__uint16)uVar49)
                                    ;
                                    bVar54 = (uVar37 & local_4a00) == 0;
                                    iVar12 = iVar11 + 1;
                                    if ((int)uVar37 < 0x1000 && bVar54) {
                                      iVar11 = iVar12;
                                    }
                                    if ((int)uVar37 < 0x1000 && bVar54) {
                                      local_4a00 = ~(-1 << ((byte)iVar12 & 0x1f));
                                    }
                                    goto LAB_001101b5;
                                  }
                                  stbi__g_failure_reason = "too many codes";
                                  uVar37 = uVar35;
                                }
                                bVar54 = false;
                              }
                              bVar53 = false;
                              local_4a08 = (stbi__context *)0x0;
                              uVar49 = uVar15;
                              bVar30 = bVar54;
                            }
                            goto LAB_001101b5;
                          }
                          if (uVar48 == 0) {
                            pbVar28 = s->img_buffer;
                            if (pbVar28 < s->img_buffer_end) {
LAB_0010ff82:
                              s->img_buffer = pbVar28 + 1;
                              bVar31 = *pbVar28;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                                if (iVar13 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar26;
                                  s->img_buffer_end = psVar1;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar26;
                                  s->img_buffer_end = psVar26 + iVar13;
                                }
                                pbVar28 = s->img_buffer;
                                goto LAB_0010ff82;
                              }
                              bVar31 = 0;
                            }
                            if (bVar31 == 0) {
                              local_4a08 = (stbi__context *)local_4888._8_8_;
                              goto LAB_001102ed;
                            }
                            uVar48 = (uint)bVar31;
                          }
                          pbVar28 = s->img_buffer;
                          if (pbVar28 < s->img_buffer_end) {
LAB_00110019:
                            s->img_buffer = pbVar28 + 1;
                            uVar49 = (uint)*pbVar28;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
                              if (iVar13 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar26;
                                s->img_buffer_end = psVar1;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar26;
                                s->img_buffer_end = psVar26 + iVar13;
                              }
                              pbVar28 = s->img_buffer;
                              goto LAB_00110019;
                            }
                            uVar49 = 0;
                          }
                          bVar31 = (byte)iVar12;
                          uVar48 = uVar48 - 1;
                          iVar12 = iVar12 + 8;
                          uVar40 = uVar40 | uVar49 << (bVar31 & 0x1f);
                        } while( true );
                      }
                      local_4a08 = (stbi__context *)0x0;
LAB_001102ed:
                      if (local_4a08 != (stbi__context *)0x0) {
                        psVar29 = local_4a08;
                        if ((req_comp & 0xfffffffbU) != 0) {
                          psVar29 = (stbi__context *)
                                    stbi__convert_format
                                              ((uchar *)local_4a08,4,req_comp,local_4888._0_4_,
                                               local_4888._4_4_);
                        }
                        goto LAB_0010fb92;
                      }
                      goto LAB_0010fb90;
                    }
                  }
                  stbi__g_failure_reason = "bad Image Descriptor";
                }
LAB_0010fb90:
                psVar29 = (stbi__context *)0x0;
              }
LAB_0010fb92:
              data_00 = (stbi__context *)0x0;
              if (psVar29 != s) {
                data_00 = psVar29;
              }
              if (data_00 == (stbi__context *)0x0) {
                return (uchar *)0x0;
              }
              *x = local_4888._0_4_;
LAB_0010fbc1:
              *y = local_4888._4_4_;
              return (uchar *)data_00;
            }
          }
        }
      }
    }
  }
  else if (s->read_from_callbacks != 0) {
    psVar26 = s->buffer_start;
    iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar26,s->buflen);
    if (iVar11 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar26;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar26;
      s->img_buffer_end = psVar26 + iVar11;
    }
    psVar26 = s->img_buffer;
    goto LAB_0010dba3;
  }
LAB_0010eaf4:
  s->img_buffer = s->img_buffer_original;
LAB_0010eb04:
  iVar11 = stbi__psd_test(s);
  if (iVar11 != 0) {
    psVar26 = stbi__psd_load(s,x,y,comp,req_comp);
    return psVar26;
  }
  iVar11 = stbi__pic_test(s);
  if (iVar11 != 0) {
    psVar26 = stbi__pic_load(s,x,y,comp,req_comp);
    return psVar26;
  }
  iVar11 = stbi__pnm_test(s);
  if (iVar11 != 0) {
    psVar26 = stbi__pnm_load(s,x,y,comp,req_comp);
    return psVar26;
  }
  iVar11 = stbi__hdr_test(s);
  if (iVar11 == 0) {
    iVar11 = stbi__tga_test(s);
    if (iVar11 == 0) {
      stbi__g_failure_reason = "unknown image type";
      return (uchar *)0x0;
    }
    psVar26 = stbi__tga_load(s,x,y,comp,req_comp);
    return psVar26;
  }
  data_01 = stbi__hdr_load(s,x,y,comp,req_comp);
  if (req_comp == 0) {
    req_comp = *comp;
  }
  psVar26 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
  return psVar26;
LAB_0010d623:
  iVar11 = 0;
LAB_0010d63c:
  if (iVar11 == 0) goto LAB_0010e1bf;
  if (local_160 == 0xff) {
    do {
      uVar6 = local_4888._0_8_;
      if (((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read ==
          (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010d676:
        if (*(stbi_uc **)(uVar6 + 0xc0) <= *(stbi_uc **)(uVar6 + 0xb8)) goto LAB_0010c24f;
      }
      else {
        iVar11 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->eof)
                           (*(void **)(local_4888._0_8_ + 0x28));
        if (iVar11 != 0) {
          if (*(int *)(uVar6 + 0x30) != 0) goto LAB_0010d676;
          goto LAB_0010c24f;
        }
      }
      uVar6 = local_4888._0_8_;
      psVar26 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
      if (psVar26 < *(stbi_uc **)(local_4888._0_8_ + 0xc0)) {
LAB_0010d6ff:
        *(stbi_uc **)(uVar6 + 0xb8) = psVar26 + 1;
        sVar8 = *psVar26;
      }
      else {
        if (*(int *)(local_4888._0_8_ + 0x30) != 0) {
          psVar26 = (stbi_uc *)(local_4888._0_8_ + 0x38);
          iVar11 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read)
                             (*(void **)(local_4888._0_8_ + 0x28),(char *)psVar26,
                              *(int *)(local_4888._0_8_ + 0x34));
          if (iVar11 == 0) {
            *(int *)(uVar6 + 0x30) = 0;
            *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
            *(stbi_uc **)(uVar6 + 0xc0) = (stbi_uc *)(uVar6 + 0x38) + 1;
            *(stbi_uc *)(uVar6 + 0x38) = '\0';
          }
          else {
            *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
            *(stbi_uc **)(uVar6 + 0xc0) = psVar26 + iVar11;
          }
          psVar26 = *(stbi_uc **)(uVar6 + 0xb8);
          goto LAB_0010d6ff;
        }
        sVar8 = '\0';
      }
      uVar6 = local_4888._0_8_;
      if (sVar8 != '\0') {
        if (sVar8 == 0xff) {
          pbVar28 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
          if (pbVar28 < *(stbi_uc **)(local_4888._0_8_ + 0xc0)) {
LAB_0010d7a8:
            *(byte **)(uVar6 + 0xb8) = pbVar28 + 1;
            local_160 = *pbVar28;
          }
          else {
            if (*(int *)(local_4888._0_8_ + 0x30) != 0) {
              psVar26 = (stbi_uc *)(local_4888._0_8_ + 0x38);
              iVar11 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read)
                                 (*(void **)(local_4888._0_8_ + 0x28),(char *)psVar26,
                                  *(int *)(local_4888._0_8_ + 0x34));
              if (iVar11 == 0) {
                *(int *)(uVar6 + 0x30) = 0;
                *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                *(stbi_uc **)(uVar6 + 0xc0) = (stbi_uc *)(uVar6 + 0x38) + 1;
                *(stbi_uc *)(uVar6 + 0x38) = '\0';
              }
              else {
                *(stbi_uc **)(uVar6 + 0xb8) = psVar26;
                *(stbi_uc **)(uVar6 + 0xc0) = psVar26 + iVar11;
              }
              pbVar28 = *(stbi_uc **)(uVar6 + 0xb8);
              goto LAB_0010d7a8;
            }
            local_160 = 0;
          }
          sVar8 = '\b';
        }
        else {
          stbi__g_failure_reason = "junk before marker";
          sVar8 = '\x01';
        }
      }
    } while (sVar8 == '\0');
    if (sVar8 != '\b') goto LAB_0010e1bf;
  }
  goto LAB_0010c24f;
LAB_00110156:
  uVar48 = 0;
  local_4a08 = (stbi__context *)local_4888._8_8_;
  bVar53 = false;
  uVar49 = uVar15;
  bVar30 = bVar54;
LAB_001101b5:
  iVar12 = iVar13;
  uVar40 = (int)uVar40 >> (bVar31 & 0x1f);
  uVar15 = uVar49;
  bVar54 = bVar30;
  if (!bVar53) goto LAB_001102ed;
  goto LAB_0010fef3;
}

Assistant:

static unsigned char *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}